

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx2::CurveNvIntersectorK<4,8>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx2::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [28];
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [32];
  Primitive PVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  code *pcVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  long lVar25;
  ulong uVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  long lVar80;
  undefined1 auVar81 [32];
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined8 uVar91;
  undefined8 uVar92;
  undefined1 auVar93 [32];
  undefined1 auVar94 [28];
  int iVar95;
  uint uVar96;
  ulong uVar97;
  uint uVar98;
  ulong uVar99;
  long lVar100;
  ulong uVar101;
  undefined4 uVar102;
  undefined8 uVar103;
  float fVar121;
  vint4 bi_2;
  undefined1 auVar104 [16];
  float fVar120;
  float fVar122;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar123;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar108 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar124;
  float fVar142;
  vint4 bi_1;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [64];
  undefined1 auVar143 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  vint4 ai_2;
  undefined1 auVar161 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar160 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar166 [64];
  vint4 ai;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar176;
  float fVar188;
  vint4 bi;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  vint4 ai_1;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined4 uVar199;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined4 uVar207;
  float fVar208;
  float fVar214;
  float fVar215;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [64];
  undefined1 auVar224 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  undefined1 local_8a0 [32];
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  RTCFilterFunctionNArguments local_7d0;
  undefined1 local_7a0 [32];
  undefined1 (*local_768) [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined4 uStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [2] [32];
  undefined4 local_640;
  undefined4 uStack_63c;
  undefined4 uStack_638;
  undefined4 uStack_634;
  undefined4 uStack_630;
  undefined4 uStack_62c;
  undefined4 uStack_628;
  undefined4 uStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float local_5a0;
  uint uStack_59c;
  uint uStack_598;
  uint uStack_594;
  uint uStack_590;
  uint uStack_58c;
  uint uStack_588;
  uint uStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  int local_3a0;
  int local_39c;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  float local_320 [4];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  
  PVar8 = prim[1];
  uVar101 = (ulong)(byte)PVar8;
  lVar80 = uVar101 * 0x19;
  fVar208 = *(float *)(prim + lVar80 + 0x12);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar12 = vsubps_avx(auVar12,*(undefined1 (*) [16])(prim + lVar80 + 6));
  auVar104._0_4_ = fVar208 * auVar12._0_4_;
  auVar104._4_4_ = fVar208 * auVar12._4_4_;
  auVar104._8_4_ = fVar208 * auVar12._8_4_;
  auVar104._12_4_ = fVar208 * auVar12._12_4_;
  auVar177._0_4_ = fVar208 * auVar13._0_4_;
  auVar177._4_4_ = fVar208 * auVar13._4_4_;
  auVar177._8_4_ = fVar208 * auVar13._8_4_;
  auVar177._12_4_ = fVar208 * auVar13._12_4_;
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 * 4 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 * 5 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 * 6 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 * 0xb + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar101 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  uVar97 = (ulong)(uint)((int)(uVar101 * 9) * 2);
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 + 6)));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 + uVar101 + 6)));
  auVar106 = vcvtdq2ps_avx(auVar106);
  uVar97 = (ulong)(uint)((int)(uVar101 * 5) << 2);
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 + 6)));
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar225._4_4_ = auVar177._0_4_;
  auVar225._0_4_ = auVar177._0_4_;
  auVar225._8_4_ = auVar177._0_4_;
  auVar225._12_4_ = auVar177._0_4_;
  auVar126 = vshufps_avx(auVar177,auVar177,0x55);
  auVar105 = vshufps_avx(auVar177,auVar177,0xaa);
  fVar208 = auVar105._0_4_;
  auVar209._0_4_ = fVar208 * auVar15._0_4_;
  fVar120 = auVar105._4_4_;
  auVar209._4_4_ = fVar120 * auVar15._4_4_;
  fVar121 = auVar105._8_4_;
  auVar209._8_4_ = fVar121 * auVar15._8_4_;
  fVar122 = auVar105._12_4_;
  auVar209._12_4_ = fVar122 * auVar15._12_4_;
  auVar205._0_4_ = auVar18._0_4_ * fVar208;
  auVar205._4_4_ = auVar18._4_4_ * fVar120;
  auVar205._8_4_ = auVar18._8_4_ * fVar121;
  auVar205._12_4_ = auVar18._12_4_ * fVar122;
  auVar195._0_4_ = auVar143._0_4_ * fVar208;
  auVar195._4_4_ = auVar143._4_4_ * fVar120;
  auVar195._8_4_ = auVar143._8_4_ * fVar121;
  auVar195._12_4_ = auVar143._12_4_ * fVar122;
  auVar105 = vfmadd231ps_fma(auVar209,auVar126,auVar13);
  auVar127 = vfmadd231ps_fma(auVar205,auVar126,auVar17);
  auVar126 = vfmadd231ps_fma(auVar195,auVar106,auVar126);
  auVar160 = vfmadd231ps_fma(auVar105,auVar225,auVar12);
  auVar127 = vfmadd231ps_fma(auVar127,auVar225,auVar16);
  auVar168 = vfmadd231ps_fma(auVar126,auVar107,auVar225);
  auVar226._4_4_ = auVar104._0_4_;
  auVar226._0_4_ = auVar104._0_4_;
  auVar226._8_4_ = auVar104._0_4_;
  auVar226._12_4_ = auVar104._0_4_;
  auVar126 = vshufps_avx(auVar104,auVar104,0x55);
  auVar105 = vshufps_avx(auVar104,auVar104,0xaa);
  fVar208 = auVar105._0_4_;
  auVar178._0_4_ = fVar208 * auVar15._0_4_;
  fVar120 = auVar105._4_4_;
  auVar178._4_4_ = fVar120 * auVar15._4_4_;
  fVar121 = auVar105._8_4_;
  auVar178._8_4_ = fVar121 * auVar15._8_4_;
  fVar122 = auVar105._12_4_;
  auVar178._12_4_ = fVar122 * auVar15._12_4_;
  auVar125._0_4_ = auVar18._0_4_ * fVar208;
  auVar125._4_4_ = auVar18._4_4_ * fVar120;
  auVar125._8_4_ = auVar18._8_4_ * fVar121;
  auVar125._12_4_ = auVar18._12_4_ * fVar122;
  auVar105._0_4_ = auVar143._0_4_ * fVar208;
  auVar105._4_4_ = auVar143._4_4_ * fVar120;
  auVar105._8_4_ = auVar143._8_4_ * fVar121;
  auVar105._12_4_ = auVar143._12_4_ * fVar122;
  auVar13 = vfmadd231ps_fma(auVar178,auVar126,auVar13);
  auVar15 = vfmadd231ps_fma(auVar125,auVar126,auVar17);
  auVar17 = vfmadd231ps_fma(auVar105,auVar126,auVar106);
  auVar18 = vfmadd231ps_fma(auVar13,auVar226,auVar12);
  auVar106 = vfmadd231ps_fma(auVar15,auVar226,auVar16);
  auVar143 = vfmadd231ps_fma(auVar17,auVar226,auVar107);
  local_410._8_4_ = 0x7fffffff;
  local_410._0_8_ = 0x7fffffff7fffffff;
  local_410._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx(auVar160,local_410);
  auVar167._8_4_ = 0x219392ef;
  auVar167._0_8_ = 0x219392ef219392ef;
  auVar167._12_4_ = 0x219392ef;
  auVar12 = vcmpps_avx(auVar12,auVar167,1);
  auVar13 = vblendvps_avx(auVar160,auVar167,auVar12);
  auVar12 = vandps_avx(auVar127,local_410);
  auVar12 = vcmpps_avx(auVar12,auVar167,1);
  auVar15 = vblendvps_avx(auVar127,auVar167,auVar12);
  auVar12 = vandps_avx(auVar168,local_410);
  auVar12 = vcmpps_avx(auVar12,auVar167,1);
  auVar12 = vblendvps_avx(auVar168,auVar167,auVar12);
  auVar16 = vrcpps_avx(auVar13);
  auVar192._8_4_ = 0x3f800000;
  auVar192._0_8_ = 0x3f8000003f800000;
  auVar192._12_4_ = 0x3f800000;
  auVar13 = vfnmadd213ps_fma(auVar13,auVar16,auVar192);
  auVar16 = vfmadd132ps_fma(auVar13,auVar16,auVar16);
  auVar13 = vrcpps_avx(auVar15);
  auVar15 = vfnmadd213ps_fma(auVar15,auVar13,auVar192);
  auVar17 = vfmadd132ps_fma(auVar15,auVar13,auVar13);
  auVar13 = vrcpps_avx(auVar12);
  auVar12 = vfnmadd213ps_fma(auVar12,auVar13,auVar192);
  auVar107 = vfmadd132ps_fma(auVar12,auVar13,auVar13);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar101 * 7 + 6);
  auVar12 = vpmovsxwd_avx(auVar12);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar18);
  auVar168._0_4_ = auVar16._0_4_ * auVar12._0_4_;
  auVar168._4_4_ = auVar16._4_4_ * auVar12._4_4_;
  auVar168._8_4_ = auVar16._8_4_ * auVar12._8_4_;
  auVar168._12_4_ = auVar16._12_4_ * auVar12._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar101 * 9 + 6);
  auVar12 = vpmovsxwd_avx(auVar13);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar18);
  auVar179._0_4_ = auVar16._0_4_ * auVar12._0_4_;
  auVar179._4_4_ = auVar16._4_4_ * auVar12._4_4_;
  auVar179._8_4_ = auVar16._8_4_ * auVar12._8_4_;
  auVar179._12_4_ = auVar16._12_4_ * auVar12._12_4_;
  auVar127._1_3_ = 0;
  auVar127[0] = PVar8;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar13 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar101 * -2 + 6);
  auVar12 = vpmovsxwd_avx(auVar16);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar106);
  auVar196._0_4_ = auVar12._0_4_ * auVar17._0_4_;
  auVar196._4_4_ = auVar12._4_4_ * auVar17._4_4_;
  auVar196._8_4_ = auVar12._8_4_ * auVar17._8_4_;
  auVar196._12_4_ = auVar12._12_4_ * auVar17._12_4_;
  auVar12 = vcvtdq2ps_avx(auVar13);
  auVar12 = vsubps_avx(auVar12,auVar106);
  auVar126._0_4_ = auVar17._0_4_ * auVar12._0_4_;
  auVar126._4_4_ = auVar17._4_4_ * auVar12._4_4_;
  auVar126._8_4_ = auVar17._8_4_ * auVar12._8_4_;
  auVar126._12_4_ = auVar17._12_4_ * auVar12._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar97 + uVar101 + 6);
  auVar12 = vpmovsxwd_avx(auVar17);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar143);
  auVar160._0_4_ = auVar107._0_4_ * auVar12._0_4_;
  auVar160._4_4_ = auVar107._4_4_ * auVar12._4_4_;
  auVar160._8_4_ = auVar107._8_4_ * auVar12._8_4_;
  auVar160._12_4_ = auVar107._12_4_ * auVar12._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar101 * 0x17 + 6);
  auVar12 = vpmovsxwd_avx(auVar18);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar143);
  auVar106._0_4_ = auVar107._0_4_ * auVar12._0_4_;
  auVar106._4_4_ = auVar107._4_4_ * auVar12._4_4_;
  auVar106._8_4_ = auVar107._8_4_ * auVar12._8_4_;
  auVar106._12_4_ = auVar107._12_4_ * auVar12._12_4_;
  auVar12 = vpminsd_avx(auVar168,auVar179);
  auVar13 = vpminsd_avx(auVar196,auVar126);
  auVar12 = vmaxps_avx(auVar12,auVar13);
  auVar13 = vpminsd_avx(auVar160,auVar106);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar200._4_4_ = uVar4;
  auVar200._0_4_ = uVar4;
  auVar200._8_4_ = uVar4;
  auVar200._12_4_ = uVar4;
  auVar13 = vmaxps_avx(auVar13,auVar200);
  auVar12 = vmaxps_avx(auVar12,auVar13);
  local_420._0_4_ = auVar12._0_4_ * 0.99999964;
  local_420._4_4_ = auVar12._4_4_ * 0.99999964;
  local_420._8_4_ = auVar12._8_4_ * 0.99999964;
  local_420._12_4_ = auVar12._12_4_ * 0.99999964;
  auVar12 = vpmaxsd_avx(auVar168,auVar179);
  auVar13 = vpmaxsd_avx(auVar196,auVar126);
  auVar12 = vminps_avx(auVar12,auVar13);
  auVar13 = vpmaxsd_avx(auVar160,auVar106);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar143._4_4_ = uVar4;
  auVar143._0_4_ = uVar4;
  auVar143._8_4_ = uVar4;
  auVar143._12_4_ = uVar4;
  auVar13 = vminps_avx(auVar13,auVar143);
  auVar12 = vminps_avx(auVar12,auVar13);
  auVar107._0_4_ = auVar12._0_4_ * 1.0000004;
  auVar107._4_4_ = auVar12._4_4_ * 1.0000004;
  auVar107._8_4_ = auVar12._8_4_ * 1.0000004;
  auVar107._12_4_ = auVar12._12_4_ * 1.0000004;
  auVar127[4] = PVar8;
  auVar127._5_3_ = 0;
  auVar127[8] = PVar8;
  auVar127._9_3_ = 0;
  auVar127[0xc] = PVar8;
  auVar127._13_3_ = 0;
  auVar13 = vpcmpgtd_avx(auVar127,_DAT_01f7fcf0);
  auVar12 = vcmpps_avx(local_420,auVar107,2);
  auVar12 = vandps_avx(auVar12,auVar13);
  uVar98 = vmovmskps_avx(auVar12);
  if (uVar98 != 0) {
    uVar98 = uVar98 & 0xff;
    local_680[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_680[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_680[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_680[1]._24_8_ = mm_lookupmask_ps._24_8_;
    local_768 = (undefined1 (*) [32])&local_180;
    iVar95 = 1 << ((uint)k & 0x1f);
    auVar109._4_4_ = iVar95;
    auVar109._0_4_ = iVar95;
    auVar109._8_4_ = iVar95;
    auVar109._12_4_ = iVar95;
    auVar109._16_4_ = iVar95;
    auVar109._20_4_ = iVar95;
    auVar109._24_4_ = iVar95;
    auVar109._28_4_ = iVar95;
    auVar117 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar109 = vpand_avx2(auVar109,auVar117);
    local_2c0 = vpcmpeqd_avx2(auVar109,auVar117);
    do {
      lVar25 = 0;
      uVar101 = (ulong)uVar98;
      for (uVar97 = uVar101; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar101 = uVar101 - 1 & uVar101;
      uVar4 = *(undefined4 *)(prim + lVar25 * 4 + 6);
      uVar97 = (ulong)(uint)((int)lVar25 << 6);
      local_8a0._4_4_ = *(undefined4 *)(prim + 2);
      pGVar9 = (context->scene->geometries).items[(uint)local_8a0._4_4_].ptr;
      pPVar1 = prim + uVar97 + lVar80 + 0x16;
      uVar91 = *(undefined8 *)pPVar1;
      uVar92 = *(undefined8 *)(pPVar1 + 8);
      auVar15 = *(undefined1 (*) [16])pPVar1;
      auVar13 = *(undefined1 (*) [16])pPVar1;
      auVar12 = *(undefined1 (*) [16])pPVar1;
      if (uVar101 != 0) {
        uVar99 = uVar101 - 1 & uVar101;
        for (uVar26 = uVar101; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
        }
        if (uVar99 != 0) {
          for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x8000000000000000) {
          }
        }
      }
      auVar16 = *(undefined1 (*) [16])(prim + uVar97 + lVar80 + 0x26);
      auVar17 = *(undefined1 (*) [16])(prim + uVar97 + lVar80 + 0x36);
      auVar18 = *(undefined1 (*) [16])(prim + uVar97 + lVar80 + 0x46);
      iVar95 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar107 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar126 = vinsertps_avx(auVar107,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar106 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar126);
      uVar102 = auVar106._0_4_;
      auVar169._4_4_ = uVar102;
      auVar169._0_4_ = uVar102;
      auVar169._8_4_ = uVar102;
      auVar169._12_4_ = uVar102;
      auVar107 = vshufps_avx(auVar106,auVar106,0x55);
      auVar106 = vshufps_avx(auVar106,auVar106,0xaa);
      aVar5 = pre->ray_space[k].vx.field_0;
      aVar6 = pre->ray_space[k].vy.field_0;
      fVar208 = pre->ray_space[k].vz.field_0.m128[0];
      fVar120 = pre->ray_space[k].vz.field_0.m128[1];
      fVar121 = pre->ray_space[k].vz.field_0.m128[2];
      fVar122 = pre->ray_space[k].vz.field_0.m128[3];
      auVar189._0_4_ = fVar208 * auVar106._0_4_;
      auVar189._4_4_ = fVar120 * auVar106._4_4_;
      auVar189._8_4_ = fVar121 * auVar106._8_4_;
      auVar189._12_4_ = fVar122 * auVar106._12_4_;
      auVar107 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar6,auVar107);
      auVar127 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar5,auVar169);
      auVar107 = vblendps_avx(auVar127,*(undefined1 (*) [16])pPVar1,8);
      auVar143 = vsubps_avx(auVar16,auVar126);
      uVar102 = auVar143._0_4_;
      auVar190._4_4_ = uVar102;
      auVar190._0_4_ = uVar102;
      auVar190._8_4_ = uVar102;
      auVar190._12_4_ = uVar102;
      auVar106 = vshufps_avx(auVar143,auVar143,0x55);
      auVar143 = vshufps_avx(auVar143,auVar143,0xaa);
      auVar201._0_4_ = fVar208 * auVar143._0_4_;
      auVar201._4_4_ = fVar120 * auVar143._4_4_;
      auVar201._8_4_ = fVar121 * auVar143._8_4_;
      auVar201._12_4_ = fVar122 * auVar143._12_4_;
      auVar106 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar6,auVar106);
      auVar160 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar5,auVar190);
      auVar106 = vblendps_avx(auVar160,auVar16,8);
      auVar105 = vsubps_avx(auVar17,auVar126);
      uVar102 = auVar105._0_4_;
      auVar193._4_4_ = uVar102;
      auVar193._0_4_ = uVar102;
      auVar193._8_4_ = uVar102;
      auVar193._12_4_ = uVar102;
      auVar143 = vshufps_avx(auVar105,auVar105,0x55);
      auVar105 = vshufps_avx(auVar105,auVar105,0xaa);
      auVar210._0_4_ = fVar208 * auVar105._0_4_;
      auVar210._4_4_ = fVar120 * auVar105._4_4_;
      auVar210._8_4_ = fVar121 * auVar105._8_4_;
      auVar210._12_4_ = fVar122 * auVar105._12_4_;
      auVar143 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar6,auVar143);
      auVar168 = vfmadd231ps_fma(auVar143,(undefined1  [16])aVar5,auVar193);
      auVar143 = vblendps_avx(auVar168,auVar17,8);
      auVar105 = vsubps_avx(auVar18,auVar126);
      uVar102 = auVar105._0_4_;
      auVar194._4_4_ = uVar102;
      auVar194._0_4_ = uVar102;
      auVar194._8_4_ = uVar102;
      auVar194._12_4_ = uVar102;
      auVar126 = vshufps_avx(auVar105,auVar105,0x55);
      auVar105 = vshufps_avx(auVar105,auVar105,0xaa);
      auVar220._0_4_ = fVar208 * auVar105._0_4_;
      auVar220._4_4_ = fVar120 * auVar105._4_4_;
      auVar220._8_4_ = fVar121 * auVar105._8_4_;
      auVar220._12_4_ = fVar122 * auVar105._12_4_;
      auVar126 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar6,auVar126);
      auVar104 = vfmadd231ps_fma(auVar126,(undefined1  [16])aVar5,auVar194);
      auVar126 = vblendps_avx(auVar104,auVar18,8);
      auVar107 = vandps_avx(auVar107,local_410);
      auVar106 = vandps_avx(auVar106,local_410);
      auVar105 = vmaxps_avx(auVar107,auVar106);
      auVar107 = vandps_avx(auVar143,local_410);
      auVar106 = vandps_avx(auVar126,local_410);
      auVar107 = vmaxps_avx(auVar107,auVar106);
      auVar107 = vmaxps_avx(auVar105,auVar107);
      auVar106 = vmovshdup_avx(auVar107);
      auVar106 = vmaxss_avx(auVar106,auVar107);
      auVar107 = vshufpd_avx(auVar107,auVar107,1);
      auVar107 = vmaxss_avx(auVar107,auVar106);
      lVar25 = (long)iVar95 * 0x44;
      auVar106 = vmovshdup_avx(auVar127);
      uVar103 = auVar106._0_8_;
      local_540._8_8_ = uVar103;
      local_540._0_8_ = uVar103;
      local_540._16_8_ = uVar103;
      local_540._24_8_ = uVar103;
      auVar106 = vmovshdup_avx(auVar160);
      uVar103 = auVar106._0_8_;
      local_560._8_8_ = uVar103;
      local_560._0_8_ = uVar103;
      local_560._16_8_ = uVar103;
      local_560._24_8_ = uVar103;
      auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x908);
      uVar207 = auVar168._0_4_;
      local_720._4_4_ = uVar207;
      local_720._0_4_ = uVar207;
      local_720._8_4_ = uVar207;
      local_720._12_4_ = uVar207;
      local_720._16_4_ = uVar207;
      local_720._20_4_ = uVar207;
      local_720._24_4_ = uVar207;
      local_720._28_4_ = uVar207;
      auVar106 = vmovshdup_avx(auVar168);
      uVar103 = auVar106._0_8_;
      local_6c0._8_8_ = uVar103;
      local_6c0._0_8_ = uVar103;
      local_6c0._16_8_ = uVar103;
      local_6c0._24_8_ = uVar103;
      fVar208 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar25 + 0xd8c);
      auVar94 = *(undefined1 (*) [28])(bezier_basis0 + lVar25 + 0xd8c);
      local_520 = auVar104._0_4_;
      auVar106 = vmovshdup_avx(auVar104);
      local_280 = auVar106._0_8_;
      auVar117._4_4_ = local_520 * *(float *)(bezier_basis0 + lVar25 + 0xd90);
      auVar117._0_4_ = local_520 * fVar208;
      auVar117._8_4_ = local_520 * *(float *)(bezier_basis0 + lVar25 + 0xd94);
      auVar117._12_4_ = local_520 * *(float *)(bezier_basis0 + lVar25 + 0xd98);
      auVar117._16_4_ = local_520 * *(float *)(bezier_basis0 + lVar25 + 0xd9c);
      auVar117._20_4_ = local_520 * *(float *)(bezier_basis0 + lVar25 + 0xda0);
      auVar117._24_4_ = local_520 * *(float *)(bezier_basis0 + lVar25 + 0xda4);
      auVar117._28_4_ = *(undefined4 *)(bezier_basis0 + lVar25 + 0xda8);
      auVar143 = vfmadd231ps_fma(auVar117,auVar109,local_720);
      fVar176 = auVar106._0_4_;
      auVar116._0_4_ = fVar176 * fVar208;
      fVar188 = auVar106._4_4_;
      auVar116._4_4_ = fVar188 * *(float *)(bezier_basis0 + lVar25 + 0xd90);
      auVar116._8_4_ = fVar176 * *(float *)(bezier_basis0 + lVar25 + 0xd94);
      auVar116._12_4_ = fVar188 * *(float *)(bezier_basis0 + lVar25 + 0xd98);
      auVar116._16_4_ = fVar176 * *(float *)(bezier_basis0 + lVar25 + 0xd9c);
      auVar116._20_4_ = fVar188 * *(float *)(bezier_basis0 + lVar25 + 0xda0);
      auVar116._24_4_ = fVar176 * *(float *)(bezier_basis0 + lVar25 + 0xda4);
      auVar116._28_4_ = 0;
      auVar106 = vfmadd231ps_fma(auVar116,auVar109,local_6c0);
      auVar117 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x484);
      uVar199 = auVar160._0_4_;
      auVar172._4_4_ = uVar199;
      auVar172._0_4_ = uVar199;
      auVar172._8_4_ = uVar199;
      auVar172._12_4_ = uVar199;
      auVar172._16_4_ = uVar199;
      auVar172._20_4_ = uVar199;
      auVar172._24_4_ = uVar199;
      auVar172._28_4_ = uVar199;
      auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar117,auVar172);
      auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar117,local_560);
      auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar25);
      uVar102 = auVar127._0_4_;
      auVar227._4_4_ = uVar102;
      auVar227._0_4_ = uVar102;
      auVar227._8_4_ = uVar102;
      auVar227._12_4_ = uVar102;
      auVar227._16_4_ = uVar102;
      auVar227._20_4_ = uVar102;
      auVar227._24_4_ = uVar102;
      auVar227._28_4_ = uVar102;
      auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar116,auVar227);
      auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar116,local_540);
      auVar132 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x908);
      fVar216 = *(float *)(bezier_basis1 + lVar25 + 0xd8c);
      fVar217 = *(float *)(bezier_basis1 + lVar25 + 0xd90);
      fVar218 = *(float *)(bezier_basis1 + lVar25 + 0xd94);
      fVar219 = *(float *)(bezier_basis1 + lVar25 + 0xd98);
      fVar123 = *(float *)(bezier_basis1 + lVar25 + 0xd9c);
      fVar82 = *(float *)(bezier_basis1 + lVar25 + 0xda0);
      fVar83 = *(float *)(bezier_basis1 + lVar25 + 0xda4);
      auVar221._4_4_ = local_520 * fVar217;
      auVar221._0_4_ = local_520 * fVar216;
      auVar221._8_4_ = local_520 * fVar218;
      auVar221._12_4_ = local_520 * fVar219;
      auVar221._16_4_ = local_520 * fVar123;
      auVar221._20_4_ = local_520 * fVar82;
      auVar221._24_4_ = local_520 * fVar83;
      auVar221._28_4_ = *(undefined4 *)(bezier_basis0 + lVar25 + 0xda8);
      auVar126 = vfmadd231ps_fma(auVar221,auVar132,local_720);
      uStack_278 = local_280;
      uStack_270 = local_280;
      uStack_268 = local_280;
      auVar7._4_4_ = fVar217 * fVar188;
      auVar7._0_4_ = fVar216 * fVar176;
      auVar7._8_4_ = fVar218 * fVar176;
      auVar7._12_4_ = fVar219 * fVar188;
      auVar7._16_4_ = fVar123 * fVar176;
      auVar7._20_4_ = fVar82 * fVar188;
      auVar7._24_4_ = fVar83 * fVar176;
      auVar7._28_4_ = uVar207;
      auVar105 = vfmadd231ps_fma(auVar7,auVar132,local_6c0);
      auVar221 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x484);
      auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar221,auVar172);
      auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar221,local_560);
      auVar7 = *(undefined1 (*) [32])(bezier_basis1 + lVar25);
      auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar7,auVar227);
      auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar7,local_540);
      local_460 = ZEXT1632(auVar126);
      local_440 = ZEXT1632(auVar143);
      local_580 = vsubps_avx(local_460,local_440);
      _local_5c0 = ZEXT1632(auVar105);
      local_480 = ZEXT1632(auVar106);
      local_4a0 = vsubps_avx(_local_5c0,local_480);
      auVar110._0_4_ = auVar106._0_4_ * local_580._0_4_;
      auVar110._4_4_ = auVar106._4_4_ * local_580._4_4_;
      auVar110._8_4_ = auVar106._8_4_ * local_580._8_4_;
      auVar110._12_4_ = auVar106._12_4_ * local_580._12_4_;
      auVar110._16_4_ = local_580._16_4_ * 0.0;
      auVar110._20_4_ = local_580._20_4_ * 0.0;
      auVar110._24_4_ = local_580._24_4_ * 0.0;
      auVar110._28_4_ = 0;
      fVar208 = local_4a0._0_4_;
      auVar128._0_4_ = auVar143._0_4_ * fVar208;
      fVar120 = local_4a0._4_4_;
      auVar128._4_4_ = auVar143._4_4_ * fVar120;
      fVar121 = local_4a0._8_4_;
      auVar128._8_4_ = auVar143._8_4_ * fVar121;
      fVar122 = local_4a0._12_4_;
      auVar128._12_4_ = auVar143._12_4_ * fVar122;
      fVar14 = local_4a0._16_4_;
      auVar128._16_4_ = fVar14 * 0.0;
      fVar214 = local_4a0._20_4_;
      auVar128._20_4_ = fVar214 * 0.0;
      fVar215 = local_4a0._24_4_;
      auVar128._24_4_ = fVar215 * 0.0;
      auVar128._28_4_ = 0;
      auVar110 = vsubps_avx(auVar110,auVar128);
      auVar106 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
      uVar103 = auVar106._0_8_;
      local_80._8_8_ = uVar103;
      local_80._0_8_ = uVar103;
      local_80._16_8_ = uVar103;
      local_80._24_8_ = uVar103;
      auVar143 = vpermilps_avx(auVar16,0xff);
      uVar103 = auVar143._0_8_;
      local_a0._8_8_ = uVar103;
      local_a0._0_8_ = uVar103;
      local_a0._16_8_ = uVar103;
      local_a0._24_8_ = uVar103;
      auVar143 = vpermilps_avx(auVar17,0xff);
      uVar103 = auVar143._0_8_;
      local_c0._8_8_ = uVar103;
      local_c0._0_8_ = uVar103;
      local_c0._16_8_ = uVar103;
      local_c0._24_8_ = uVar103;
      auVar143 = vpermilps_avx(auVar18,0xff);
      local_e0 = auVar143._0_8_;
      local_900 = auVar94._0_4_;
      fStack_8fc = auVar94._4_4_;
      fStack_8f8 = auVar94._8_4_;
      fStack_8f4 = auVar94._12_4_;
      fStack_8f0 = auVar94._16_4_;
      fStack_8ec = auVar94._20_4_;
      fStack_8e8 = auVar94._24_4_;
      fVar124 = auVar143._0_4_;
      fVar142 = auVar143._4_4_;
      auVar197._4_4_ = fVar142 * fStack_8fc;
      auVar197._0_4_ = fVar124 * local_900;
      auVar197._8_4_ = fVar124 * fStack_8f8;
      auVar197._12_4_ = fVar142 * fStack_8f4;
      auVar197._16_4_ = fVar124 * fStack_8f0;
      auVar197._20_4_ = fVar142 * fStack_8ec;
      auVar197._24_4_ = fVar124 * fStack_8e8;
      auVar197._28_4_ = uVar199;
      auVar143 = vfmadd231ps_fma(auVar197,local_c0,auVar109);
      auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar117,local_a0);
      auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar116,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar23._4_4_ = fVar217 * fVar142;
      auVar23._0_4_ = fVar216 * fVar124;
      auVar23._8_4_ = fVar218 * fVar124;
      auVar23._12_4_ = fVar219 * fVar142;
      auVar23._16_4_ = fVar123 * fVar124;
      auVar23._20_4_ = fVar82 * fVar142;
      auVar23._24_4_ = fVar83 * fVar124;
      auVar23._28_4_ = fVar142;
      auVar126 = vfmadd231ps_fma(auVar23,auVar132,local_c0);
      auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar221,local_a0);
      auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar7,local_80);
      auVar156._4_4_ = fVar120 * fVar120;
      auVar156._0_4_ = fVar208 * fVar208;
      auVar156._8_4_ = fVar121 * fVar121;
      auVar156._12_4_ = fVar122 * fVar122;
      auVar156._16_4_ = fVar14 * fVar14;
      auVar156._20_4_ = fVar214 * fVar214;
      auVar156._24_4_ = fVar215 * fVar215;
      auVar156._28_4_ = auVar106._4_4_;
      auVar106 = vfmadd231ps_fma(auVar156,local_580,local_580);
      auVar156 = ZEXT1632(auVar126);
      auVar197 = vmaxps_avx(ZEXT1632(auVar143),auVar156);
      auVar24._4_4_ = auVar197._4_4_ * auVar197._4_4_ * auVar106._4_4_;
      auVar24._0_4_ = auVar197._0_4_ * auVar197._0_4_ * auVar106._0_4_;
      auVar24._8_4_ = auVar197._8_4_ * auVar197._8_4_ * auVar106._8_4_;
      auVar24._12_4_ = auVar197._12_4_ * auVar197._12_4_ * auVar106._12_4_;
      auVar24._16_4_ = auVar197._16_4_ * auVar197._16_4_ * 0.0;
      auVar24._20_4_ = auVar197._20_4_ * auVar197._20_4_ * 0.0;
      auVar24._24_4_ = auVar197._24_4_ * auVar197._24_4_ * 0.0;
      auVar24._28_4_ = auVar197._28_4_;
      auVar22._4_4_ = auVar110._4_4_ * auVar110._4_4_;
      auVar22._0_4_ = auVar110._0_4_ * auVar110._0_4_;
      auVar22._8_4_ = auVar110._8_4_ * auVar110._8_4_;
      auVar22._12_4_ = auVar110._12_4_ * auVar110._12_4_;
      auVar22._16_4_ = auVar110._16_4_ * auVar110._16_4_;
      auVar22._20_4_ = auVar110._20_4_ * auVar110._20_4_;
      auVar22._24_4_ = auVar110._24_4_ * auVar110._24_4_;
      auVar22._28_4_ = 0;
      auVar197 = vcmpps_avx(auVar22,auVar24,2);
      fVar208 = auVar107._0_4_ * 4.7683716e-07;
      auVar111._0_4_ = (float)iVar95;
      uStack_59c = auVar104._4_4_;
      uStack_598 = auVar104._8_4_;
      uStack_594 = auVar104._12_4_;
      auVar111._4_4_ = auVar111._0_4_;
      auVar111._8_4_ = auVar111._0_4_;
      auVar111._12_4_ = auVar111._0_4_;
      auVar111._16_4_ = auVar111._0_4_;
      auVar111._20_4_ = auVar111._0_4_;
      auVar111._24_4_ = auVar111._0_4_;
      auVar111._28_4_ = auVar111._0_4_;
      auVar110 = vcmpps_avx(_DAT_01faff40,auVar111,1);
      auVar107 = vpermilps_avx(auVar127,0xaa);
      uVar103 = auVar107._0_8_;
      auVar163._8_8_ = uVar103;
      auVar163._0_8_ = uVar103;
      auVar163._16_8_ = uVar103;
      auVar163._24_8_ = uVar103;
      auVar107 = vpermilps_avx(auVar160,0xaa);
      uVar103 = auVar107._0_8_;
      local_740._8_8_ = uVar103;
      local_740._0_8_ = uVar103;
      local_740._16_8_ = uVar103;
      local_740._24_8_ = uVar103;
      auVar106 = vpermilps_avx(auVar168,0xaa);
      uVar103 = auVar106._0_8_;
      auVar206._8_8_ = uVar103;
      auVar206._0_8_ = uVar103;
      auVar206._16_8_ = uVar103;
      auVar206._24_8_ = uVar103;
      auVar107 = vshufps_avx(auVar104,auVar104,0xaa);
      uVar103 = auVar107._0_8_;
      register0x00001508 = uVar103;
      local_700 = uVar103;
      register0x00001510 = uVar103;
      register0x00001518 = uVar103;
      auVar223 = ZEXT3264(_local_700);
      auVar23 = auVar110 & auVar197;
      uVar98 = *(uint *)(ray + k * 4 + 0x60);
      local_620._0_16_ = ZEXT416(uVar98);
      local_850 = auVar16._0_8_;
      uStack_848 = auVar16._8_8_;
      local_860 = auVar17._0_8_;
      uStack_858 = auVar17._8_8_;
      local_870._0_4_ = auVar18._0_4_;
      fVar120 = (float)local_870;
      local_870._4_4_ = auVar18._4_4_;
      fVar121 = local_870._4_4_;
      uStack_868._0_4_ = auVar18._8_4_;
      fVar122 = (float)uStack_868;
      uStack_868._4_4_ = auVar18._12_4_;
      fVar14 = uStack_868._4_4_;
      local_870 = auVar18._0_8_;
      uStack_868 = auVar18._8_8_;
      local_5a0 = auVar111._0_4_;
      fStack_51c = local_520;
      fStack_518 = local_520;
      fStack_514 = local_520;
      fStack_510 = local_520;
      fStack_50c = local_520;
      fStack_508 = local_520;
      fStack_504 = local_520;
      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar23 >> 0x7f,0) == '\0') &&
            (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar23 >> 0xbf,0) == '\0') &&
          (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar23[0x1f])
      {
        auVar212 = ZEXT3264(local_740);
        auVar141 = ZEXT3264(local_720);
        auVar166 = ZEXT3264(local_6c0);
      }
      else {
        local_640 = SUB84(pGVar9,0);
        uStack_63c = (undefined4)((ulong)pGVar9 >> 0x20);
        _local_4c0 = vandps_avx(auVar197,auVar110);
        fVar124 = auVar107._0_4_;
        fVar142 = auVar107._4_4_;
        auVar19._4_4_ = fVar142 * fVar217;
        auVar19._0_4_ = fVar124 * fVar216;
        auVar19._8_4_ = fVar124 * fVar218;
        auVar19._12_4_ = fVar142 * fVar219;
        auVar19._16_4_ = fVar124 * fVar123;
        auVar19._20_4_ = fVar142 * fVar82;
        auVar19._24_4_ = fVar124 * fVar83;
        auVar19._28_4_ = local_4c0._28_4_;
        auVar18 = vfmadd213ps_fma(auVar132,auVar206,auVar19);
        auVar18 = vfmadd213ps_fma(auVar221,local_740,ZEXT1632(auVar18));
        auVar18 = vfmadd213ps_fma(auVar7,auVar163,ZEXT1632(auVar18));
        auVar112._0_4_ = fVar124 * local_900;
        auVar112._4_4_ = fVar142 * fStack_8fc;
        auVar112._8_4_ = fVar124 * fStack_8f8;
        auVar112._12_4_ = fVar142 * fStack_8f4;
        auVar112._16_4_ = fVar124 * fStack_8f0;
        auVar112._20_4_ = fVar142 * fStack_8ec;
        auVar112._24_4_ = fVar124 * fStack_8e8;
        auVar112._28_4_ = 0;
        auVar107 = vfmadd213ps_fma(auVar109,auVar206,auVar112);
        auVar107 = vfmadd213ps_fma(auVar117,local_740,ZEXT1632(auVar107));
        auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1210);
        auVar132 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1694);
        auVar221 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1b18);
        fVar214 = *(float *)(bezier_basis0 + lVar25 + 0x1f9c);
        fVar215 = *(float *)(bezier_basis0 + lVar25 + 0x1fa0);
        fVar216 = *(float *)(bezier_basis0 + lVar25 + 0x1fa4);
        fVar217 = *(float *)(bezier_basis0 + lVar25 + 0x1fa8);
        fVar218 = *(float *)(bezier_basis0 + lVar25 + 0x1fac);
        fVar219 = *(float *)(bezier_basis0 + lVar25 + 0x1fb0);
        fVar123 = *(float *)(bezier_basis0 + lVar25 + 0x1fb4);
        auVar184._0_4_ = local_520 * fVar214;
        auVar184._4_4_ = local_520 * fVar215;
        auVar184._8_4_ = local_520 * fVar216;
        auVar184._12_4_ = local_520 * fVar217;
        auVar184._16_4_ = local_520 * fVar218;
        auVar184._20_4_ = local_520 * fVar219;
        auVar184._24_4_ = local_520 * fVar123;
        auVar184._28_4_ = 0;
        auVar20._4_4_ = fVar188 * fVar215;
        auVar20._0_4_ = fVar176 * fVar214;
        auVar20._8_4_ = fVar176 * fVar216;
        auVar20._12_4_ = fVar188 * fVar217;
        auVar20._16_4_ = fVar176 * fVar218;
        auVar20._20_4_ = fVar188 * fVar219;
        auVar20._24_4_ = fVar176 * fVar123;
        auVar20._28_4_ = auVar117._28_4_;
        auVar21._4_4_ = fVar215 * fVar142;
        auVar21._0_4_ = fVar214 * fVar124;
        auVar21._8_4_ = fVar216 * fVar124;
        auVar21._12_4_ = fVar217 * fVar142;
        auVar21._16_4_ = fVar218 * fVar124;
        auVar21._20_4_ = fVar219 * fVar142;
        auVar21._24_4_ = fVar123 * fVar124;
        auVar21._28_4_ = auVar106._4_4_;
        auVar106 = vfmadd231ps_fma(auVar184,auVar221,local_720);
        auVar126 = vfmadd231ps_fma(auVar20,auVar221,local_6c0);
        auVar105 = vfmadd231ps_fma(auVar21,auVar206,auVar221);
        auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar132,auVar172);
        auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar132,local_560);
        auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),local_740,auVar132);
        auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar109,auVar227);
        auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar109,local_540);
        auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar109,auVar163);
        fVar214 = *(float *)(bezier_basis1 + lVar25 + 0x1f9c);
        fVar215 = *(float *)(bezier_basis1 + lVar25 + 0x1fa0);
        fVar216 = *(float *)(bezier_basis1 + lVar25 + 0x1fa4);
        fVar217 = *(float *)(bezier_basis1 + lVar25 + 0x1fa8);
        fVar218 = *(float *)(bezier_basis1 + lVar25 + 0x1fac);
        fVar219 = *(float *)(bezier_basis1 + lVar25 + 0x1fb0);
        fVar123 = *(float *)(bezier_basis1 + lVar25 + 0x1fb4);
        auVar132._4_4_ = local_520 * fVar215;
        auVar132._0_4_ = local_520 * fVar214;
        auVar132._8_4_ = local_520 * fVar216;
        auVar132._12_4_ = local_520 * fVar217;
        auVar132._16_4_ = local_520 * fVar218;
        auVar132._20_4_ = local_520 * fVar219;
        auVar132._24_4_ = local_520 * fVar123;
        auVar132._28_4_ = local_520;
        auVar173._4_4_ = fVar188 * fVar215;
        auVar173._0_4_ = fVar176 * fVar214;
        auVar173._8_4_ = fVar176 * fVar216;
        auVar173._12_4_ = fVar188 * fVar217;
        auVar173._16_4_ = fVar176 * fVar218;
        auVar173._20_4_ = fVar188 * fVar219;
        auVar173._24_4_ = fVar176 * fVar123;
        auVar173._28_4_ = fVar188;
        auVar27._4_4_ = fVar142 * fVar215;
        auVar27._0_4_ = fVar124 * fVar214;
        auVar27._8_4_ = fVar124 * fVar216;
        auVar27._12_4_ = fVar142 * fVar217;
        auVar27._16_4_ = fVar124 * fVar218;
        auVar27._20_4_ = fVar142 * fVar219;
        auVar27._24_4_ = fVar124 * fVar123;
        auVar27._28_4_ = fVar142;
        auVar109 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1b18);
        auVar127 = vfmadd231ps_fma(auVar132,auVar109,local_720);
        auVar160 = vfmadd231ps_fma(auVar173,auVar109,local_6c0);
        auVar168 = vfmadd231ps_fma(auVar27,auVar206,auVar109);
        auVar109 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1694);
        auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar109,auVar172);
        auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar109,local_560);
        auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),local_740,auVar109);
        auVar109 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1210);
        auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar109,auVar227);
        auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar109,local_540);
        auVar129._8_4_ = 0x7fffffff;
        auVar129._0_8_ = 0x7fffffff7fffffff;
        auVar129._12_4_ = 0x7fffffff;
        auVar129._16_4_ = 0x7fffffff;
        auVar129._20_4_ = 0x7fffffff;
        auVar129._24_4_ = 0x7fffffff;
        auVar129._28_4_ = 0x7fffffff;
        auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar163,auVar109);
        auVar109 = vandps_avx(ZEXT1632(auVar106),auVar129);
        auVar117 = vandps_avx(ZEXT1632(auVar126),auVar129);
        auVar117 = vmaxps_avx(auVar109,auVar117);
        auVar109 = vandps_avx(ZEXT1632(auVar105),auVar129);
        auVar109 = vmaxps_avx(auVar117,auVar109);
        auVar154._4_4_ = fVar208;
        auVar154._0_4_ = fVar208;
        auVar154._8_4_ = fVar208;
        auVar154._12_4_ = fVar208;
        auVar154._16_4_ = fVar208;
        auVar154._20_4_ = fVar208;
        auVar154._24_4_ = fVar208;
        auVar154._28_4_ = fVar208;
        auVar109 = vcmpps_avx(auVar109,auVar154,1);
        auVar132 = vblendvps_avx(ZEXT1632(auVar106),local_580,auVar109);
        auVar221 = vblendvps_avx(ZEXT1632(auVar126),local_4a0,auVar109);
        auVar109 = vandps_avx(ZEXT1632(auVar127),auVar129);
        auVar117 = vandps_avx(ZEXT1632(auVar160),auVar129);
        auVar7 = vmaxps_avx(auVar109,auVar117);
        auVar109 = vandps_avx(ZEXT1632(auVar168),auVar129);
        auVar109 = vmaxps_avx(auVar7,auVar109);
        auVar197 = vcmpps_avx(auVar109,auVar154,1);
        auVar109 = vblendvps_avx(ZEXT1632(auVar127),local_580,auVar197);
        auVar7 = vblendvps_avx(ZEXT1632(auVar160),local_4a0,auVar197);
        auVar107 = vfmadd213ps_fma(auVar116,auVar163,ZEXT1632(auVar107));
        auVar106 = vfmadd213ps_fma(auVar132,auVar132,ZEXT832(0) << 0x20);
        auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar221,auVar221);
        auVar116 = vrsqrtps_avx(ZEXT1632(auVar106));
        fVar214 = auVar116._0_4_;
        fVar215 = auVar116._4_4_;
        fVar216 = auVar116._8_4_;
        fVar217 = auVar116._12_4_;
        fVar218 = auVar116._16_4_;
        fVar219 = auVar116._20_4_;
        fVar123 = auVar116._24_4_;
        auVar28._4_4_ = fVar215 * fVar215 * fVar215 * auVar106._4_4_ * -0.5;
        auVar28._0_4_ = fVar214 * fVar214 * fVar214 * auVar106._0_4_ * -0.5;
        auVar28._8_4_ = fVar216 * fVar216 * fVar216 * auVar106._8_4_ * -0.5;
        auVar28._12_4_ = fVar217 * fVar217 * fVar217 * auVar106._12_4_ * -0.5;
        auVar28._16_4_ = fVar218 * fVar218 * fVar218 * -0.0;
        auVar28._20_4_ = fVar219 * fVar219 * fVar219 * -0.0;
        auVar28._24_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar28._28_4_ = 0;
        auVar228._8_4_ = 0x3fc00000;
        auVar228._0_8_ = 0x3fc000003fc00000;
        auVar228._12_4_ = 0x3fc00000;
        auVar228._16_4_ = 0x3fc00000;
        auVar228._20_4_ = 0x3fc00000;
        auVar228._24_4_ = 0x3fc00000;
        auVar228._28_4_ = 0x3fc00000;
        auVar106 = vfmadd231ps_fma(auVar28,auVar228,auVar116);
        fVar214 = auVar106._0_4_;
        fVar215 = auVar106._4_4_;
        auVar29._4_4_ = auVar221._4_4_ * fVar215;
        auVar29._0_4_ = auVar221._0_4_ * fVar214;
        fVar216 = auVar106._8_4_;
        auVar29._8_4_ = auVar221._8_4_ * fVar216;
        fVar217 = auVar106._12_4_;
        auVar29._12_4_ = auVar221._12_4_ * fVar217;
        auVar29._16_4_ = auVar221._16_4_ * 0.0;
        auVar29._20_4_ = auVar221._20_4_ * 0.0;
        auVar29._24_4_ = auVar221._24_4_ * 0.0;
        auVar29._28_4_ = auVar116._28_4_;
        auVar30._4_4_ = fVar215 * -auVar132._4_4_;
        auVar30._0_4_ = fVar214 * -auVar132._0_4_;
        auVar30._8_4_ = fVar216 * -auVar132._8_4_;
        auVar30._12_4_ = fVar217 * -auVar132._12_4_;
        auVar30._16_4_ = -auVar132._16_4_ * 0.0;
        auVar30._20_4_ = -auVar132._20_4_ * 0.0;
        auVar30._24_4_ = -auVar132._24_4_ * 0.0;
        auVar30._28_4_ = auVar117._28_4_;
        auVar106 = vfmadd213ps_fma(auVar109,auVar109,ZEXT832(0) << 0x20);
        auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar7,auVar7);
        auVar117 = vrsqrtps_avx(ZEXT1632(auVar106));
        auVar31._28_4_ = auVar197._28_4_;
        auVar31._0_28_ =
             ZEXT1628(CONCAT412(fVar217 * 0.0,
                                CONCAT48(fVar216 * 0.0,CONCAT44(fVar215 * 0.0,fVar214 * 0.0))));
        fVar214 = auVar117._0_4_;
        fVar215 = auVar117._4_4_;
        fVar216 = auVar117._8_4_;
        fVar217 = auVar117._12_4_;
        fVar218 = auVar117._16_4_;
        fVar219 = auVar117._20_4_;
        fVar123 = auVar117._24_4_;
        auVar32._4_4_ = fVar215 * fVar215 * fVar215 * auVar106._4_4_ * -0.5;
        auVar32._0_4_ = fVar214 * fVar214 * fVar214 * auVar106._0_4_ * -0.5;
        auVar32._8_4_ = fVar216 * fVar216 * fVar216 * auVar106._8_4_ * -0.5;
        auVar32._12_4_ = fVar217 * fVar217 * fVar217 * auVar106._12_4_ * -0.5;
        auVar32._16_4_ = fVar218 * fVar218 * fVar218 * -0.0;
        auVar32._20_4_ = fVar219 * fVar219 * fVar219 * -0.0;
        auVar32._24_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar32._28_4_ = 0;
        auVar106 = vfmadd231ps_fma(auVar32,auVar228,auVar117);
        fVar214 = auVar106._0_4_;
        fVar215 = auVar106._4_4_;
        auVar33._4_4_ = auVar7._4_4_ * fVar215;
        auVar33._0_4_ = auVar7._0_4_ * fVar214;
        fVar216 = auVar106._8_4_;
        auVar33._8_4_ = auVar7._8_4_ * fVar216;
        fVar217 = auVar106._12_4_;
        auVar33._12_4_ = auVar7._12_4_ * fVar217;
        auVar33._16_4_ = auVar7._16_4_ * 0.0;
        auVar33._20_4_ = auVar7._20_4_ * 0.0;
        auVar33._24_4_ = auVar7._24_4_ * 0.0;
        auVar33._28_4_ = 0;
        auVar34._4_4_ = -auVar109._4_4_ * fVar215;
        auVar34._0_4_ = -auVar109._0_4_ * fVar214;
        auVar34._8_4_ = -auVar109._8_4_ * fVar216;
        auVar34._12_4_ = -auVar109._12_4_ * fVar217;
        auVar34._16_4_ = -auVar109._16_4_ * 0.0;
        auVar34._20_4_ = -auVar109._20_4_ * 0.0;
        auVar34._24_4_ = -auVar109._24_4_ * 0.0;
        auVar34._28_4_ = auVar7._28_4_;
        auVar35._28_4_ = auVar117._28_4_;
        auVar35._0_28_ =
             ZEXT1628(CONCAT412(fVar217 * 0.0,
                                CONCAT48(fVar216 * 0.0,CONCAT44(fVar215 * 0.0,fVar214 * 0.0))));
        auVar106 = vfmadd213ps_fma(auVar29,ZEXT1632(auVar143),local_440);
        auVar109 = ZEXT1632(auVar143);
        auVar126 = vfmadd213ps_fma(auVar30,auVar109,local_480);
        auVar105 = vfmadd213ps_fma(auVar31,auVar109,ZEXT1632(auVar107));
        auVar168 = vfnmadd213ps_fma(auVar29,auVar109,local_440);
        auVar127 = vfmadd213ps_fma(auVar33,auVar156,local_460);
        auVar104 = vfnmadd213ps_fma(auVar30,auVar109,local_480);
        auVar160 = vfmadd213ps_fma(auVar34,auVar156,_local_5c0);
        auVar173 = ZEXT1632(auVar143);
        auVar177 = vfnmadd231ps_fma(ZEXT1632(auVar107),auVar173,auVar31);
        auVar107 = vfmadd213ps_fma(auVar35,auVar156,ZEXT1632(auVar18));
        auVar125 = vfnmadd213ps_fma(auVar33,auVar156,local_460);
        auVar167 = vfnmadd213ps_fma(auVar34,auVar156,_local_5c0);
        auVar178 = vfnmadd231ps_fma(ZEXT1632(auVar18),auVar156,auVar35);
        auVar109 = vsubps_avx(ZEXT1632(auVar160),ZEXT1632(auVar104));
        auVar117 = vsubps_avx(ZEXT1632(auVar107),ZEXT1632(auVar177));
        auVar36._4_4_ = auVar177._4_4_ * auVar109._4_4_;
        auVar36._0_4_ = auVar177._0_4_ * auVar109._0_4_;
        auVar36._8_4_ = auVar177._8_4_ * auVar109._8_4_;
        auVar36._12_4_ = auVar177._12_4_ * auVar109._12_4_;
        auVar36._16_4_ = auVar109._16_4_ * 0.0;
        auVar36._20_4_ = auVar109._20_4_ * 0.0;
        auVar36._24_4_ = auVar109._24_4_ * 0.0;
        auVar36._28_4_ = 0;
        auVar143 = vfmsub231ps_fma(auVar36,ZEXT1632(auVar104),auVar117);
        auVar37._4_4_ = auVar168._4_4_ * auVar117._4_4_;
        auVar37._0_4_ = auVar168._0_4_ * auVar117._0_4_;
        auVar37._8_4_ = auVar168._8_4_ * auVar117._8_4_;
        auVar37._12_4_ = auVar168._12_4_ * auVar117._12_4_;
        auVar37._16_4_ = auVar117._16_4_ * 0.0;
        auVar37._20_4_ = auVar117._20_4_ * 0.0;
        auVar37._24_4_ = auVar117._24_4_ * 0.0;
        auVar37._28_4_ = auVar117._28_4_;
        auVar197 = ZEXT1632(auVar168);
        auVar117 = vsubps_avx(ZEXT1632(auVar127),auVar197);
        auVar18 = vfmsub231ps_fma(auVar37,ZEXT1632(auVar177),auVar117);
        auVar38._4_4_ = auVar104._4_4_ * auVar117._4_4_;
        auVar38._0_4_ = auVar104._0_4_ * auVar117._0_4_;
        auVar38._8_4_ = auVar104._8_4_ * auVar117._8_4_;
        auVar38._12_4_ = auVar104._12_4_ * auVar117._12_4_;
        auVar38._16_4_ = auVar117._16_4_ * 0.0;
        auVar38._20_4_ = auVar117._20_4_ * 0.0;
        auVar38._24_4_ = auVar117._24_4_ * 0.0;
        auVar38._28_4_ = auVar117._28_4_;
        auVar168 = vfmsub231ps_fma(auVar38,auVar197,auVar109);
        auVar109 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar109,ZEXT1632(auVar18));
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar109,ZEXT1632(auVar143));
        auVar24 = vcmpps_avx(ZEXT1632(auVar18),ZEXT1232(ZEXT412(0)) << 0x20,2);
        auVar109 = vblendvps_avx(ZEXT1632(auVar125),ZEXT1632(auVar106),auVar24);
        auVar117 = vblendvps_avx(ZEXT1632(auVar167),ZEXT1632(auVar126),auVar24);
        auVar116 = vblendvps_avx(ZEXT1632(auVar178),ZEXT1632(auVar105),auVar24);
        auVar132 = vblendvps_avx(auVar197,ZEXT1632(auVar127),auVar24);
        auVar221 = vblendvps_avx(ZEXT1632(auVar104),ZEXT1632(auVar160),auVar24);
        auVar7 = vblendvps_avx(ZEXT1632(auVar177),ZEXT1632(auVar107),auVar24);
        auVar197 = vblendvps_avx(ZEXT1632(auVar127),auVar197,auVar24);
        auVar110 = vblendvps_avx(ZEXT1632(auVar160),ZEXT1632(auVar104),auVar24);
        auVar18 = vpackssdw_avx(local_4c0._0_16_,local_4c0._16_16_);
        auVar23 = vblendvps_avx(ZEXT1632(auVar107),ZEXT1632(auVar177),auVar24);
        auVar22 = vsubps_avx(auVar197,auVar109);
        auVar110 = vsubps_avx(auVar110,auVar117);
        auVar128 = vsubps_avx(auVar23,auVar116);
        auVar19 = vsubps_avx(auVar109,auVar132);
        auVar20 = vsubps_avx(auVar117,auVar221);
        auVar21 = vsubps_avx(auVar116,auVar7);
        auVar39._4_4_ = auVar128._4_4_ * auVar109._4_4_;
        auVar39._0_4_ = auVar128._0_4_ * auVar109._0_4_;
        auVar39._8_4_ = auVar128._8_4_ * auVar109._8_4_;
        auVar39._12_4_ = auVar128._12_4_ * auVar109._12_4_;
        auVar39._16_4_ = auVar128._16_4_ * auVar109._16_4_;
        auVar39._20_4_ = auVar128._20_4_ * auVar109._20_4_;
        auVar39._24_4_ = auVar128._24_4_ * auVar109._24_4_;
        auVar39._28_4_ = auVar23._28_4_;
        auVar107 = vfmsub231ps_fma(auVar39,auVar116,auVar22);
        auVar40._4_4_ = auVar22._4_4_ * auVar117._4_4_;
        auVar40._0_4_ = auVar22._0_4_ * auVar117._0_4_;
        auVar40._8_4_ = auVar22._8_4_ * auVar117._8_4_;
        auVar40._12_4_ = auVar22._12_4_ * auVar117._12_4_;
        auVar40._16_4_ = auVar22._16_4_ * auVar117._16_4_;
        auVar40._20_4_ = auVar22._20_4_ * auVar117._20_4_;
        auVar40._24_4_ = auVar22._24_4_ * auVar117._24_4_;
        auVar40._28_4_ = auVar197._28_4_;
        auVar106 = vfmsub231ps_fma(auVar40,auVar109,auVar110);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT832(0) << 0x20,ZEXT1632(auVar107));
        auVar113._0_4_ = auVar110._0_4_ * auVar116._0_4_;
        auVar113._4_4_ = auVar110._4_4_ * auVar116._4_4_;
        auVar113._8_4_ = auVar110._8_4_ * auVar116._8_4_;
        auVar113._12_4_ = auVar110._12_4_ * auVar116._12_4_;
        auVar113._16_4_ = auVar110._16_4_ * auVar116._16_4_;
        auVar113._20_4_ = auVar110._20_4_ * auVar116._20_4_;
        auVar113._24_4_ = auVar110._24_4_ * auVar116._24_4_;
        auVar113._28_4_ = 0;
        auVar106 = vfmsub231ps_fma(auVar113,auVar117,auVar128);
        auVar106 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT832(0) << 0x20,ZEXT1632(auVar106));
        auVar114._0_4_ = auVar21._0_4_ * auVar132._0_4_;
        auVar114._4_4_ = auVar21._4_4_ * auVar132._4_4_;
        auVar114._8_4_ = auVar21._8_4_ * auVar132._8_4_;
        auVar114._12_4_ = auVar21._12_4_ * auVar132._12_4_;
        auVar114._16_4_ = auVar21._16_4_ * auVar132._16_4_;
        auVar114._20_4_ = auVar21._20_4_ * auVar132._20_4_;
        auVar114._24_4_ = auVar21._24_4_ * auVar132._24_4_;
        auVar114._28_4_ = 0;
        auVar107 = vfmsub231ps_fma(auVar114,auVar19,auVar7);
        auVar41._4_4_ = auVar20._4_4_ * auVar7._4_4_;
        auVar41._0_4_ = auVar20._0_4_ * auVar7._0_4_;
        auVar41._8_4_ = auVar20._8_4_ * auVar7._8_4_;
        auVar41._12_4_ = auVar20._12_4_ * auVar7._12_4_;
        auVar41._16_4_ = auVar20._16_4_ * auVar7._16_4_;
        auVar41._20_4_ = auVar20._20_4_ * auVar7._20_4_;
        auVar41._24_4_ = auVar20._24_4_ * auVar7._24_4_;
        auVar41._28_4_ = auVar7._28_4_;
        auVar143 = vfmsub231ps_fma(auVar41,auVar221,auVar21);
        auVar42._4_4_ = auVar19._4_4_ * auVar221._4_4_;
        auVar42._0_4_ = auVar19._0_4_ * auVar221._0_4_;
        auVar42._8_4_ = auVar19._8_4_ * auVar221._8_4_;
        auVar42._12_4_ = auVar19._12_4_ * auVar221._12_4_;
        auVar42._16_4_ = auVar19._16_4_ * auVar221._16_4_;
        auVar42._20_4_ = auVar19._20_4_ * auVar221._20_4_;
        auVar42._24_4_ = auVar19._24_4_ * auVar221._24_4_;
        auVar42._28_4_ = auVar221._28_4_;
        auVar126 = vfmsub231ps_fma(auVar42,auVar20,auVar132);
        auVar221 = ZEXT832(0) << 0x20;
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar221,ZEXT1632(auVar107));
        auVar143 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar221,ZEXT1632(auVar143));
        auVar132 = vmaxps_avx(ZEXT1632(auVar106),ZEXT1632(auVar143));
        auVar132 = vcmpps_avx(auVar132,ZEXT832(0) << 0x20,2);
        auVar107 = vpackssdw_avx(auVar132._0_16_,auVar132._16_16_);
        auVar18 = vpand_avx(auVar18,auVar107);
        auVar132 = vpmovsxwd_avx2(auVar18);
        if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar132 >> 0x7f,0) == '\0') &&
              (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar132 >> 0xbf,0) == '\0') &&
            (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar132[0x1f]) {
LAB_015a08e9:
          auVar175._8_8_ = local_680[1]._8_8_;
          auVar175._0_8_ = local_680[1]._0_8_;
          auVar175._16_8_ = local_680[1]._16_8_;
          auVar175._24_8_ = local_680[1]._24_8_;
        }
        else {
          auVar43._4_4_ = auVar110._4_4_ * auVar21._4_4_;
          auVar43._0_4_ = auVar110._0_4_ * auVar21._0_4_;
          auVar43._8_4_ = auVar110._8_4_ * auVar21._8_4_;
          auVar43._12_4_ = auVar110._12_4_ * auVar21._12_4_;
          auVar43._16_4_ = auVar110._16_4_ * auVar21._16_4_;
          auVar43._20_4_ = auVar110._20_4_ * auVar21._20_4_;
          auVar43._24_4_ = auVar110._24_4_ * auVar21._24_4_;
          auVar43._28_4_ = auVar132._28_4_;
          auVar127 = vfmsub231ps_fma(auVar43,auVar20,auVar128);
          auVar130._0_4_ = auVar19._0_4_ * auVar128._0_4_;
          auVar130._4_4_ = auVar19._4_4_ * auVar128._4_4_;
          auVar130._8_4_ = auVar19._8_4_ * auVar128._8_4_;
          auVar130._12_4_ = auVar19._12_4_ * auVar128._12_4_;
          auVar130._16_4_ = auVar19._16_4_ * auVar128._16_4_;
          auVar130._20_4_ = auVar19._20_4_ * auVar128._20_4_;
          auVar130._24_4_ = auVar19._24_4_ * auVar128._24_4_;
          auVar130._28_4_ = 0;
          auVar105 = vfmsub231ps_fma(auVar130,auVar22,auVar21);
          auVar44._4_4_ = auVar22._4_4_ * auVar20._4_4_;
          auVar44._0_4_ = auVar22._0_4_ * auVar20._0_4_;
          auVar44._8_4_ = auVar22._8_4_ * auVar20._8_4_;
          auVar44._12_4_ = auVar22._12_4_ * auVar20._12_4_;
          auVar44._16_4_ = auVar22._16_4_ * auVar20._16_4_;
          auVar44._20_4_ = auVar22._20_4_ * auVar20._20_4_;
          auVar44._24_4_ = auVar22._24_4_ * auVar20._24_4_;
          auVar44._28_4_ = auVar22._28_4_;
          auVar160 = vfmsub231ps_fma(auVar44,auVar19,auVar110);
          auVar107 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar105),ZEXT1632(auVar160));
          auVar126 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT1632(auVar127),auVar221);
          auVar132 = vrcpps_avx(ZEXT1632(auVar126));
          auVar211._8_4_ = 0x3f800000;
          auVar211._0_8_ = 0x3f8000003f800000;
          auVar211._12_4_ = 0x3f800000;
          auVar211._16_4_ = 0x3f800000;
          auVar211._20_4_ = 0x3f800000;
          auVar211._24_4_ = 0x3f800000;
          auVar211._28_4_ = 0x3f800000;
          auVar107 = vfnmadd213ps_fma(auVar132,ZEXT1632(auVar126),auVar211);
          auVar107 = vfmadd132ps_fma(ZEXT1632(auVar107),auVar132,auVar132);
          auVar45._4_4_ = auVar160._4_4_ * auVar116._4_4_;
          auVar45._0_4_ = auVar160._0_4_ * auVar116._0_4_;
          auVar45._8_4_ = auVar160._8_4_ * auVar116._8_4_;
          auVar45._12_4_ = auVar160._12_4_ * auVar116._12_4_;
          auVar45._16_4_ = auVar116._16_4_ * 0.0;
          auVar45._20_4_ = auVar116._20_4_ * 0.0;
          auVar45._24_4_ = auVar116._24_4_ * 0.0;
          auVar45._28_4_ = auVar116._28_4_;
          auVar105 = vfmadd231ps_fma(auVar45,auVar117,ZEXT1632(auVar105));
          auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),ZEXT1632(auVar127),auVar109);
          fVar214 = auVar107._0_4_;
          fVar215 = auVar107._4_4_;
          fVar216 = auVar107._8_4_;
          fVar217 = auVar107._12_4_;
          auVar46._28_4_ = auVar117._28_4_;
          auVar46._0_28_ =
               ZEXT1628(CONCAT412(fVar217 * auVar105._12_4_,
                                  CONCAT48(fVar216 * auVar105._8_4_,
                                           CONCAT44(fVar215 * auVar105._4_4_,
                                                    fVar214 * auVar105._0_4_))));
          auVar115._4_4_ = uVar98;
          auVar115._0_4_ = uVar98;
          auVar115._8_4_ = uVar98;
          auVar115._12_4_ = uVar98;
          auVar115._16_4_ = uVar98;
          auVar115._20_4_ = uVar98;
          auVar115._24_4_ = uVar98;
          auVar115._28_4_ = uVar98;
          uVar102 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar131._4_4_ = uVar102;
          auVar131._0_4_ = uVar102;
          auVar131._8_4_ = uVar102;
          auVar131._12_4_ = uVar102;
          auVar131._16_4_ = uVar102;
          auVar131._20_4_ = uVar102;
          auVar131._24_4_ = uVar102;
          auVar131._28_4_ = uVar102;
          auVar109 = vcmpps_avx(auVar115,auVar46,2);
          auVar117 = vcmpps_avx(auVar46,auVar131,2);
          auVar109 = vandps_avx(auVar117,auVar109);
          auVar107 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
          auVar18 = vpand_avx(auVar18,auVar107);
          auVar109 = vpmovsxwd_avx2(auVar18);
          if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar109 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar109 >> 0x7f,0) == '\0') &&
                (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar109 >> 0xbf,0) == '\0') &&
              (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar109[0x1f]) goto LAB_015a08e9;
          auVar109 = vcmpps_avx(auVar221,ZEXT1632(auVar126),4);
          auVar107 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
          auVar18 = vpand_avx(auVar18,auVar107);
          auVar109 = vpmovsxwd_avx2(auVar18);
          auVar175._8_8_ = local_680[1]._8_8_;
          auVar175._0_8_ = local_680[1]._0_8_;
          auVar175._16_8_ = local_680[1]._16_8_;
          auVar175._24_8_ = local_680[1]._24_8_;
          if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar109 >> 0x7f,0) != '\0') ||
                (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar109 >> 0xbf,0) != '\0') ||
              (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar109[0x1f] < '\0') {
            auVar116 = ZEXT1632(CONCAT412(fVar217 * auVar106._12_4_,
                                          CONCAT48(fVar216 * auVar106._8_4_,
                                                   CONCAT44(fVar215 * auVar106._4_4_,
                                                            fVar214 * auVar106._0_4_))));
            auVar132 = ZEXT1632(CONCAT412(fVar217 * auVar143._12_4_,
                                          CONCAT48(fVar216 * auVar143._8_4_,
                                                   CONCAT44(fVar215 * auVar143._4_4_,
                                                            fVar214 * auVar143._0_4_))));
            auVar174._8_4_ = 0x3f800000;
            auVar174._0_8_ = 0x3f8000003f800000;
            auVar174._12_4_ = 0x3f800000;
            auVar174._16_4_ = 0x3f800000;
            auVar174._20_4_ = 0x3f800000;
            auVar174._24_4_ = 0x3f800000;
            auVar174._28_4_ = 0x3f800000;
            auVar117 = vsubps_avx(auVar174,auVar116);
            _local_2a0 = vblendvps_avx(auVar117,auVar116,auVar24);
            auVar117 = vsubps_avx(auVar174,auVar132);
            local_4e0 = vblendvps_avx(auVar117,auVar132,auVar24);
            auVar175 = auVar109;
            local_5e0 = auVar46;
          }
        }
        auVar223 = ZEXT3264(_local_700);
        auVar212 = ZEXT3264(local_740);
        auVar166 = ZEXT3264(auVar206);
        auVar141 = ZEXT3264(auVar163);
        if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar175 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar175 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar175 >> 0x7f,0) == '\0') &&
              (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar175 >> 0xbf,0) == '\0') &&
            (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar175[0x1f]) {
          auVar141 = ZEXT3264(local_720);
          auVar166 = ZEXT3264(local_6c0);
        }
        else {
          auVar109 = vsubps_avx(auVar156,auVar173);
          auVar18 = vfmadd213ps_fma(auVar109,_local_2a0,auVar173);
          fVar214 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar47._4_4_ = (auVar18._4_4_ + auVar18._4_4_) * fVar214;
          auVar47._0_4_ = (auVar18._0_4_ + auVar18._0_4_) * fVar214;
          auVar47._8_4_ = (auVar18._8_4_ + auVar18._8_4_) * fVar214;
          auVar47._12_4_ = (auVar18._12_4_ + auVar18._12_4_) * fVar214;
          auVar47._16_4_ = fVar214 * 0.0;
          auVar47._20_4_ = fVar214 * 0.0;
          auVar47._24_4_ = fVar214 * 0.0;
          auVar47._28_4_ = 0;
          auVar109 = vcmpps_avx(local_5e0,auVar47,6);
          auVar117 = auVar175 & auVar109;
          if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar117 >> 0x7f,0) == '\0') &&
                (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar117 >> 0xbf,0) == '\0') &&
              (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar117[0x1f]) {
            auVar141 = ZEXT3264(local_720);
            auVar166 = ZEXT3264(local_6c0);
          }
          else {
            auVar133._8_4_ = 0xbf800000;
            auVar133._0_8_ = 0xbf800000bf800000;
            auVar133._12_4_ = 0xbf800000;
            auVar133._16_4_ = 0xbf800000;
            auVar133._20_4_ = 0xbf800000;
            auVar133._24_4_ = 0xbf800000;
            auVar133._28_4_ = 0xbf800000;
            auVar155._8_4_ = 0x40000000;
            auVar155._0_8_ = 0x4000000040000000;
            auVar155._12_4_ = 0x40000000;
            auVar155._16_4_ = 0x40000000;
            auVar155._20_4_ = 0x40000000;
            auVar155._24_4_ = 0x40000000;
            auVar155._28_4_ = 0x40000000;
            auVar18 = vfmadd213ps_fma(local_4e0,auVar155,auVar133);
            local_400 = _local_2a0;
            local_3e0 = ZEXT1632(auVar18);
            local_3c0 = local_5e0;
            local_3a0 = 0;
            local_380 = local_850;
            uStack_378 = uStack_848;
            local_370 = local_860;
            uStack_368 = uStack_858;
            local_360 = local_870;
            uStack_358 = uStack_868;
            local_4e0 = local_3e0;
            if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              local_6a0 = vandps_avx(auVar109,auVar175);
              fVar214 = 1.0 / auVar111._0_4_;
              local_320[0] = fVar214 * ((float)local_2a0._0_4_ + 0.0);
              local_320[1] = fVar214 * ((float)local_2a0._4_4_ + 1.0);
              local_320[2] = fVar214 * (fStack_298 + 2.0);
              local_320[3] = fVar214 * (fStack_294 + 3.0);
              fStack_310 = fVar214 * (fStack_290 + 4.0);
              fStack_30c = fVar214 * (fStack_28c + 5.0);
              fStack_308 = fVar214 * (fStack_288 + 6.0);
              fStack_304 = fStack_284 + 7.0;
              local_4e0._0_8_ = auVar18._0_8_;
              local_4e0._8_8_ = auVar18._8_8_;
              local_300 = local_4e0._0_8_;
              uStack_2f8 = local_4e0._8_8_;
              uStack_2f0 = 0;
              uStack_2e8 = 0;
              local_2e0 = local_5e0;
              auVar134._8_4_ = 0x7f800000;
              auVar134._0_8_ = 0x7f8000007f800000;
              auVar134._12_4_ = 0x7f800000;
              auVar134._16_4_ = 0x7f800000;
              auVar134._20_4_ = 0x7f800000;
              auVar134._24_4_ = 0x7f800000;
              auVar134._28_4_ = 0x7f800000;
              auVar109 = vblendvps_avx(auVar134,local_5e0,local_6a0);
              auVar117 = vshufps_avx(auVar109,auVar109,0xb1);
              auVar117 = vminps_avx(auVar109,auVar117);
              auVar116 = vshufpd_avx(auVar117,auVar117,5);
              auVar117 = vminps_avx(auVar117,auVar116);
              auVar116 = vpermpd_avx2(auVar117,0x4e);
              auVar117 = vminps_avx(auVar117,auVar116);
              auVar117 = vcmpps_avx(auVar109,auVar117,0);
              auVar116 = local_6a0 & auVar117;
              auVar109 = local_6a0;
              if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar116 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar116 >> 0x7f,0) != '\0') ||
                    (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar116 >> 0xbf,0) != '\0') ||
                  (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar116[0x1f] < '\0') {
                auVar109 = vandps_avx(auVar117,local_6a0);
              }
              uVar96 = vmovmskps_avx(auVar109);
              uVar98 = 0;
              for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
                uVar98 = uVar98 + 1;
              }
              uVar97 = (ulong)uVar98;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar214 = local_320[uVar97];
                uVar102 = *(undefined4 *)((long)&local_300 + uVar97 * 4);
                fVar216 = 1.0 - fVar214;
                fVar215 = fVar216 * fVar216 * -3.0;
                auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * fVar216)),
                                          ZEXT416((uint)(fVar214 * fVar216)),ZEXT416(0xc0000000));
                auVar18 = vfmsub132ss_fma(ZEXT416((uint)(fVar214 * fVar216)),
                                          ZEXT416((uint)(fVar214 * fVar214)),ZEXT416(0x40000000));
                fVar216 = auVar12._0_4_ * 3.0;
                fVar217 = auVar18._0_4_ * 3.0;
                fVar218 = fVar214 * fVar214 * 3.0;
                auVar180._0_4_ = fVar218 * fVar120;
                auVar180._4_4_ = fVar218 * fVar121;
                auVar180._8_4_ = fVar218 * fVar122;
                auVar180._12_4_ = fVar218 * fVar14;
                auVar144._4_4_ = fVar217;
                auVar144._0_4_ = fVar217;
                auVar144._8_4_ = fVar217;
                auVar144._12_4_ = fVar217;
                auVar12 = vfmadd132ps_fma(auVar144,auVar180,auVar17);
                auVar161._4_4_ = fVar216;
                auVar161._0_4_ = fVar216;
                auVar161._8_4_ = fVar216;
                auVar161._12_4_ = fVar216;
                auVar12 = vfmadd132ps_fma(auVar161,auVar12,auVar16);
                auVar145._4_4_ = fVar215;
                auVar145._0_4_ = fVar215;
                auVar145._8_4_ = fVar215;
                auVar145._12_4_ = fVar215;
                auVar12 = vfmadd132ps_fma(auVar145,auVar12,*(undefined1 (*) [16])pPVar1);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + uVar97 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar12._0_4_;
                uVar199 = vextractps_avx(auVar12,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar199;
                uVar199 = vextractps_avx(auVar12,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar199;
                *(float *)(ray + k * 4 + 0x1e0) = fVar214;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar102;
                *(undefined4 *)(ray + k * 4 + 0x220) = uVar4;
                *(undefined4 *)(ray + k * 4 + 0x240) = local_8a0._4_4_;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                local_8a0._0_4_ = local_8a0._4_4_;
                local_8a0._8_4_ = local_8a0._4_4_;
                local_8a0._12_4_ = local_8a0._4_4_;
                local_8a0._16_4_ = local_8a0._4_4_;
                local_8a0._20_4_ = local_8a0._4_4_;
                local_8a0._24_4_ = local_8a0._4_4_;
                local_8a0._28_4_ = local_8a0._4_4_;
                local_6e0._4_4_ = uVar4;
                local_6e0._0_4_ = uVar4;
                local_6e0._8_4_ = uVar4;
                local_6e0._12_4_ = uVar4;
                local_6e0._16_4_ = uVar4;
                local_6e0._20_4_ = uVar4;
                local_6e0._24_4_ = uVar4;
                local_6e0._28_4_ = uVar4;
                uVar102 = *(undefined4 *)(ray + k * 4 + 0x100);
                local_7a0 = auVar163;
                local_760 = auVar206;
                local_39c = iVar95;
                local_390 = uVar91;
                uStack_388 = uVar92;
                while( true ) {
                  local_200 = local_320[uVar97];
                  local_1e0 = *(undefined4 *)((long)&local_300 + uVar97 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + uVar97 * 4);
                  fVar216 = 1.0 - local_200;
                  auVar107 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * fVar216)),
                                             ZEXT416((uint)(local_200 * fVar216)),
                                             ZEXT416(0xc0000000));
                  auVar18 = vfmsub132ss_fma(ZEXT416((uint)(local_200 * fVar216)),
                                            ZEXT416((uint)(local_200 * local_200)),
                                            ZEXT416(0x40000000));
                  fVar214 = auVar18._0_4_ * 3.0;
                  fVar215 = local_200 * local_200 * 3.0;
                  auVar183._0_4_ = fVar215 * fVar120;
                  auVar183._4_4_ = fVar215 * fVar121;
                  auVar183._8_4_ = fVar215 * fVar122;
                  auVar183._12_4_ = fVar215 * fVar14;
                  auVar151._4_4_ = fVar214;
                  auVar151._0_4_ = fVar214;
                  auVar151._8_4_ = fVar214;
                  auVar151._12_4_ = fVar214;
                  auVar18 = vfmadd132ps_fma(auVar151,auVar183,auVar17);
                  fVar214 = auVar107._0_4_ * 3.0;
                  auVar171._4_4_ = fVar214;
                  auVar171._0_4_ = fVar214;
                  auVar171._8_4_ = fVar214;
                  auVar171._12_4_ = fVar214;
                  auVar18 = vfmadd132ps_fma(auVar171,auVar18,auVar16);
                  fVar214 = fVar216 * fVar216 * -3.0;
                  local_7d0.context = context->user;
                  auVar152._4_4_ = fVar214;
                  auVar152._0_4_ = fVar214;
                  auVar152._8_4_ = fVar214;
                  auVar152._12_4_ = fVar214;
                  auVar107 = vfmadd132ps_fma(auVar152,auVar18,auVar12);
                  local_260 = auVar107._0_4_;
                  uStack_25c = local_260;
                  uStack_258 = local_260;
                  uStack_254 = local_260;
                  uStack_250 = local_260;
                  uStack_24c = local_260;
                  uStack_248 = local_260;
                  uStack_244 = local_260;
                  auVar18 = vmovshdup_avx(auVar107);
                  local_240 = auVar18._0_8_;
                  uStack_238 = local_240;
                  uStack_230 = local_240;
                  uStack_228 = local_240;
                  auVar18 = vshufps_avx(auVar107,auVar107,0xaa);
                  auVar153._0_8_ = auVar18._0_8_;
                  auVar153._8_8_ = auVar153._0_8_;
                  auVar159._16_8_ = auVar153._0_8_;
                  auVar159._0_16_ = auVar153;
                  auVar159._24_8_ = auVar153._0_8_;
                  local_220 = auVar159;
                  fStack_1fc = local_200;
                  fStack_1f8 = local_200;
                  fStack_1f4 = local_200;
                  fStack_1f0 = local_200;
                  fStack_1ec = local_200;
                  fStack_1e8 = local_200;
                  fStack_1e4 = local_200;
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  local_1c0 = local_6e0._0_8_;
                  uStack_1b8 = local_6e0._8_8_;
                  uStack_1b0 = local_6e0._16_8_;
                  uStack_1a8 = local_6e0._24_8_;
                  local_1a0 = local_8a0;
                  auVar109 = vpcmpeqd_avx2(local_8a0,local_8a0);
                  local_768[1] = auVar109;
                  *local_768 = auVar109;
                  local_180 = (local_7d0.context)->instID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_160 = (local_7d0.context)->instPrimID[0];
                  uStack_15c = local_160;
                  uStack_158 = local_160;
                  uStack_154 = local_160;
                  uStack_150 = local_160;
                  uStack_14c = local_160;
                  uStack_148 = local_160;
                  uStack_144 = local_160;
                  local_680[0] = local_2c0;
                  local_7d0.valid = (int *)local_680;
                  local_7d0.geometryUserPtr = *(void **)(CONCAT44(uStack_63c,local_640) + 0x18);
                  local_7d0.hit = (RTCHitN *)&local_260;
                  local_7d0.N = 8;
                  pcVar11 = *(code **)(CONCAT44(uStack_63c,local_640) + 0x40);
                  local_7d0.ray = (RTCRayN *)ray;
                  if (pcVar11 != (code *)0x0) {
                    auVar159 = ZEXT1632(auVar153);
                    (*pcVar11)(&local_7d0);
                    auVar223 = ZEXT3264(_local_700);
                    auVar166 = ZEXT3264(local_760);
                    auVar212 = ZEXT3264(local_740);
                    auVar141 = ZEXT3264(local_7a0);
                  }
                  auVar117 = vpcmpeqd_avx2(local_680[0],_DAT_01faff00);
                  auVar116 = vpcmpeqd_avx2(auVar159,auVar159);
                  auVar109 = auVar116 & ~auVar117;
                  if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar109 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar109 >> 0x7f,0) == '\0') &&
                        (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar109 >> 0xbf,0) == '\0') &&
                      (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar109[0x1f]) {
                    auVar117 = auVar117 ^ auVar116;
                  }
                  else {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(CONCAT44(uStack_63c,local_640) + 0x3e) & 0x40) != 0)))) {
                      auVar116 = ZEXT1632(auVar116._0_16_);
                      (*p_Var10)(&local_7d0);
                      auVar223 = ZEXT3264(_local_700);
                      auVar166 = ZEXT3264(local_760);
                      auVar212 = ZEXT3264(local_740);
                      auVar141 = ZEXT3264(local_7a0);
                    }
                    auVar132 = vpcmpeqd_avx2(local_680[0],SUB6432(ZEXT1664((undefined1  [16])0x0),0)
                                            );
                    auVar116 = vpcmpeqd_avx2(auVar116,auVar116);
                    auVar117 = auVar132 ^ auVar116;
                    auVar109 = auVar116 & ~auVar132;
                    if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar109 >> 0x7f,0) != '\0') ||
                          (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar109 >> 0xbf,0) != '\0') ||
                        (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar109[0x1f] < '\0') {
                      auVar139._0_4_ = auVar132._0_4_ ^ auVar116._0_4_;
                      auVar139._4_4_ = auVar132._4_4_ ^ auVar116._4_4_;
                      auVar139._8_4_ = auVar132._8_4_ ^ auVar116._8_4_;
                      auVar139._12_4_ = auVar132._12_4_ ^ auVar116._12_4_;
                      auVar139._16_4_ = auVar132._16_4_ ^ auVar116._16_4_;
                      auVar139._20_4_ = auVar132._20_4_ ^ auVar116._20_4_;
                      auVar139._24_4_ = auVar132._24_4_ ^ auVar116._24_4_;
                      auVar139._28_4_ = auVar132._28_4_ ^ auVar116._28_4_;
                      auVar109 = vmaskmovps_avx(auVar139,*(undefined1 (*) [32])local_7d0.hit);
                      *(undefined1 (*) [32])(local_7d0.ray + 0x180) = auVar109;
                      auVar109 = vmaskmovps_avx(auVar139,*(undefined1 (*) [32])
                                                          (local_7d0.hit + 0x20));
                      *(undefined1 (*) [32])(local_7d0.ray + 0x1a0) = auVar109;
                      auVar109 = vmaskmovps_avx(auVar139,*(undefined1 (*) [32])
                                                          (local_7d0.hit + 0x40));
                      *(undefined1 (*) [32])(local_7d0.ray + 0x1c0) = auVar109;
                      auVar109 = vmaskmovps_avx(auVar139,*(undefined1 (*) [32])
                                                          (local_7d0.hit + 0x60));
                      *(undefined1 (*) [32])(local_7d0.ray + 0x1e0) = auVar109;
                      auVar109 = vmaskmovps_avx(auVar139,*(undefined1 (*) [32])
                                                          (local_7d0.hit + 0x80));
                      *(undefined1 (*) [32])(local_7d0.ray + 0x200) = auVar109;
                      auVar109 = vpmaskmovd_avx2(auVar139,*(undefined1 (*) [32])
                                                           (local_7d0.hit + 0xa0));
                      *(undefined1 (*) [32])(local_7d0.ray + 0x220) = auVar109;
                      auVar109 = vpmaskmovd_avx2(auVar139,*(undefined1 (*) [32])
                                                           (local_7d0.hit + 0xc0));
                      *(undefined1 (*) [32])(local_7d0.ray + 0x240) = auVar109;
                      auVar109 = vpmaskmovd_avx2(auVar139,*(undefined1 (*) [32])
                                                           (local_7d0.hit + 0xe0));
                      *(undefined1 (*) [32])(local_7d0.ray + 0x260) = auVar109;
                      auVar109 = vpmaskmovd_avx2(auVar139,*(undefined1 (*) [32])
                                                           (local_7d0.hit + 0x100));
                      *(undefined1 (*) [32])(local_7d0.ray + 0x280) = auVar109;
                    }
                  }
                  auVar109 = local_5e0;
                  auVar163 = auVar141._0_32_;
                  auVar206 = auVar166._0_32_;
                  if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar117 >> 0x7f,0) == '\0') &&
                        (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar117 >> 0xbf,0) == '\0') &&
                      (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar117[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar102;
                  }
                  else {
                    uVar102 = *(undefined4 *)(ray + k * 4 + 0x100);
                  }
                  *(undefined4 *)(local_6a0 + uVar97 * 4) = 0;
                  auVar119._4_4_ = uVar102;
                  auVar119._0_4_ = uVar102;
                  auVar119._8_4_ = uVar102;
                  auVar119._12_4_ = uVar102;
                  auVar119._16_4_ = uVar102;
                  auVar119._20_4_ = uVar102;
                  auVar119._24_4_ = uVar102;
                  auVar119._28_4_ = uVar102;
                  auVar116 = vcmpps_avx(auVar109,auVar119,2);
                  auVar117 = vandps_avx(auVar116,local_6a0);
                  local_6a0 = local_6a0 & auVar116;
                  if ((((((((local_6a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_6a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_6a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_6a0 >> 0x7f,0) == '\0') &&
                        (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_6a0 >> 0xbf,0) == '\0') &&
                      (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_6a0[0x1f]) break;
                  auVar140._8_4_ = 0x7f800000;
                  auVar140._0_8_ = 0x7f8000007f800000;
                  auVar140._12_4_ = 0x7f800000;
                  auVar140._16_4_ = 0x7f800000;
                  auVar140._20_4_ = 0x7f800000;
                  auVar140._24_4_ = 0x7f800000;
                  auVar140._28_4_ = 0x7f800000;
                  auVar109 = vblendvps_avx(auVar140,auVar109,auVar117);
                  auVar116 = vshufps_avx(auVar109,auVar109,0xb1);
                  auVar116 = vminps_avx(auVar109,auVar116);
                  auVar132 = vshufpd_avx(auVar116,auVar116,5);
                  auVar116 = vminps_avx(auVar116,auVar132);
                  auVar132 = vpermpd_avx2(auVar116,0x4e);
                  auVar116 = vminps_avx(auVar116,auVar132);
                  auVar116 = vcmpps_avx(auVar109,auVar116,0);
                  auVar132 = auVar117 & auVar116;
                  auVar109 = auVar117;
                  if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar132 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar132 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar132 >> 0x7f,0) != '\0') ||
                        (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar132 >> 0xbf,0) != '\0') ||
                      (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar132[0x1f] < '\0') {
                    auVar109 = vandps_avx(auVar116,auVar117);
                  }
                  uVar96 = vmovmskps_avx(auVar109);
                  uVar98 = 0;
                  for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
                    uVar98 = uVar98 + 1;
                  }
                  uVar97 = (ulong)uVar98;
                  local_6a0 = auVar117;
                }
              }
            }
            auVar141 = ZEXT3264(local_720);
            auVar166 = ZEXT3264(local_6c0);
          }
        }
      }
      if (8 < iVar95) {
        _local_700 = auVar223._0_32_;
        local_740 = auVar212._0_32_;
        local_480._4_4_ = iVar95;
        local_480._0_4_ = iVar95;
        local_480._8_4_ = iVar95;
        local_480._12_4_ = iVar95;
        local_480._16_4_ = iVar95;
        local_480._20_4_ = iVar95;
        local_480._24_4_ = iVar95;
        local_480._28_4_ = iVar95;
        local_4c0._4_4_ = fVar208;
        local_4c0._0_4_ = fVar208;
        fStack_4b8 = fVar208;
        fStack_4b4 = fVar208;
        fStack_4b0 = fVar208;
        fStack_4ac = fVar208;
        fStack_4a8 = fVar208;
        fStack_4a4 = fVar208;
        local_640 = local_620._0_4_;
        uStack_63c = local_620._0_4_;
        uStack_638 = local_620._0_4_;
        uStack_634 = local_620._0_4_;
        uStack_630 = local_620._0_4_;
        uStack_62c = local_620._0_4_;
        uStack_628 = local_620._0_4_;
        uStack_624 = local_620._0_4_;
        local_140 = 1.0 / local_5a0;
        fStack_13c = local_140;
        fStack_138 = local_140;
        fStack_134 = local_140;
        fStack_130 = local_140;
        fStack_12c = local_140;
        fStack_128 = local_140;
        fStack_124 = local_140;
        local_120 = uVar4;
        uStack_11c = uVar4;
        uStack_118 = uVar4;
        uStack_114 = uVar4;
        uStack_110 = uVar4;
        uStack_10c = uVar4;
        uStack_108 = uVar4;
        uStack_104 = uVar4;
        lVar100 = 8;
        local_7a0 = auVar163;
        local_760 = auVar206;
        local_5a0 = (float)local_8a0._4_4_;
        uStack_59c = local_8a0._4_4_;
        uStack_598 = local_8a0._4_4_;
        uStack_594 = local_8a0._4_4_;
        uStack_590 = local_8a0._4_4_;
        uStack_58c = local_8a0._4_4_;
        uStack_588 = local_8a0._4_4_;
        uStack_584 = local_8a0._4_4_;
        do {
          auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar100 * 4 + lVar25);
          auVar117 = *(undefined1 (*) [32])(lVar25 + 0x21aa768 + lVar100 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar25 + 0x21aabec + lVar100 * 4);
          pauVar2 = (undefined1 (*) [28])(lVar25 + 0x21ab070 + lVar100 * 4);
          fVar123 = *(float *)*pauVar2;
          fVar82 = *(float *)(*pauVar2 + 4);
          fVar83 = *(float *)(*pauVar2 + 8);
          fVar124 = *(float *)(*pauVar2 + 0xc);
          fVar142 = *(float *)(*pauVar2 + 0x10);
          fVar176 = *(float *)(*pauVar2 + 0x14);
          fVar188 = *(float *)(*pauVar2 + 0x18);
          auVar94 = *pauVar2;
          auVar213._0_4_ = local_520 * fVar123;
          auVar213._4_4_ = fStack_51c * fVar82;
          auVar213._8_4_ = fStack_518 * fVar83;
          auVar213._12_4_ = fStack_514 * fVar124;
          auVar213._16_4_ = fStack_510 * fVar142;
          auVar213._20_4_ = fStack_50c * fVar176;
          auVar213._28_36_ = auVar212._28_36_;
          auVar213._24_4_ = fStack_508 * fVar188;
          auVar212._0_4_ = (float)local_280 * fVar123;
          auVar212._4_4_ = local_280._4_4_ * fVar82;
          auVar212._8_4_ = (float)uStack_278 * fVar83;
          auVar212._12_4_ = uStack_278._4_4_ * fVar124;
          auVar212._16_4_ = (float)uStack_270 * fVar142;
          auVar212._20_4_ = uStack_270._4_4_ * fVar176;
          auVar212._28_36_ = auVar223._28_36_;
          auVar212._24_4_ = (float)uStack_268 * fVar188;
          auVar12 = vfmadd231ps_fma(auVar213._0_32_,auVar116,auVar141._0_32_);
          auVar18 = vfmadd231ps_fma(auVar212._0_32_,auVar116,auVar166._0_32_);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar117,auVar172);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar117,local_560);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar109,auVar227);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar109,local_540);
          auVar132 = *(undefined1 (*) [32])(bezier_basis1 + lVar100 * 4 + lVar25);
          auVar221 = *(undefined1 (*) [32])(lVar25 + 0x21acb88 + lVar100 * 4);
          auVar7 = *(undefined1 (*) [32])(lVar25 + 0x21ad00c + lVar100 * 4);
          pfVar3 = (float *)(lVar25 + 0x21ad490 + lVar100 * 4);
          fVar84 = *pfVar3;
          fVar85 = pfVar3[1];
          fVar86 = pfVar3[2];
          fVar87 = pfVar3[3];
          fVar88 = pfVar3[4];
          fVar89 = pfVar3[5];
          fVar90 = pfVar3[6];
          auVar81._4_4_ = fVar85 * fStack_51c;
          auVar81._0_4_ = fVar84 * local_520;
          auVar81._8_4_ = fVar86 * fStack_518;
          auVar81._12_4_ = fVar87 * fStack_514;
          auVar81._16_4_ = fVar88 * fStack_510;
          auVar81._20_4_ = fVar89 * fStack_50c;
          auVar81._24_4_ = fVar90 * fStack_508;
          auVar81._28_4_ = fStack_504;
          auVar48._4_4_ = local_280._4_4_ * fVar85;
          auVar48._0_4_ = (float)local_280 * fVar84;
          auVar48._8_4_ = (float)uStack_278 * fVar86;
          auVar48._12_4_ = uStack_278._4_4_ * fVar87;
          auVar48._16_4_ = (float)uStack_270 * fVar88;
          auVar48._20_4_ = uStack_270._4_4_ * fVar89;
          auVar48._24_4_ = (float)uStack_268 * fVar90;
          auVar48._28_4_ = auVar109._28_4_;
          auVar107 = vfmadd231ps_fma(auVar81,auVar7,auVar141._0_32_);
          auVar106 = vfmadd231ps_fma(auVar48,auVar7,auVar166._0_32_);
          auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar221,auVar172);
          auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar221,local_560);
          auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar132,auVar227);
          auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar132,local_540);
          local_440 = ZEXT1632(auVar107);
          local_6e0 = ZEXT1632(auVar12);
          auVar110 = vsubps_avx(local_440,local_6e0);
          local_460 = ZEXT1632(auVar18);
          local_620 = ZEXT1632(auVar106);
          auVar23 = vsubps_avx(local_620,local_460);
          auVar223 = ZEXT3264(auVar23);
          auVar79._4_4_ = auVar18._4_4_ * auVar110._4_4_;
          auVar79._0_4_ = auVar18._0_4_ * auVar110._0_4_;
          auVar79._8_4_ = auVar18._8_4_ * auVar110._8_4_;
          auVar79._12_4_ = auVar18._12_4_ * auVar110._12_4_;
          auVar79._16_4_ = auVar110._16_4_ * 0.0;
          auVar79._20_4_ = auVar110._20_4_ * 0.0;
          auVar79._24_4_ = auVar110._24_4_ * 0.0;
          auVar79._28_4_ = local_560._28_4_;
          fVar208 = auVar23._0_4_;
          auVar166._0_4_ = auVar12._0_4_ * fVar208;
          fVar214 = auVar23._4_4_;
          auVar166._4_4_ = auVar12._4_4_ * fVar214;
          fVar215 = auVar23._8_4_;
          auVar166._8_4_ = auVar12._8_4_ * fVar215;
          fVar216 = auVar23._12_4_;
          auVar166._12_4_ = auVar12._12_4_ * fVar216;
          fVar217 = auVar23._16_4_;
          auVar166._16_4_ = fVar217 * 0.0;
          fVar218 = auVar23._20_4_;
          auVar166._20_4_ = fVar218 * 0.0;
          fVar219 = auVar23._24_4_;
          auVar166._28_36_ = auVar141._28_36_;
          auVar166._24_4_ = fVar219 * 0.0;
          auVar156 = vsubps_avx(auVar79,auVar166._0_32_);
          auVar49._4_4_ = local_e0._4_4_ * fVar82;
          auVar49._0_4_ = (float)local_e0 * fVar123;
          auVar49._8_4_ = (float)uStack_d8 * fVar83;
          auVar49._12_4_ = uStack_d8._4_4_ * fVar124;
          auVar49._16_4_ = (float)uStack_d0 * fVar142;
          auVar49._20_4_ = uStack_d0._4_4_ * fVar176;
          auVar49._24_4_ = (float)uStack_c8 * fVar188;
          auVar49._28_4_ = local_560._28_4_;
          auVar12 = vfmadd231ps_fma(auVar49,auVar116,local_c0);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_a0,auVar117);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_80,auVar109);
          auVar50._4_4_ = fVar85 * local_e0._4_4_;
          auVar50._0_4_ = fVar84 * (float)local_e0;
          auVar50._8_4_ = fVar86 * (float)uStack_d8;
          auVar50._12_4_ = fVar87 * uStack_d8._4_4_;
          auVar50._16_4_ = fVar88 * (float)uStack_d0;
          auVar50._20_4_ = fVar89 * uStack_d0._4_4_;
          auVar50._24_4_ = fVar90 * (float)uStack_c8;
          auVar50._28_4_ = uStack_c8._4_4_;
          auVar18 = vfmadd231ps_fma(auVar50,auVar7,local_c0);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar221,local_a0);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar132,local_80);
          auVar51._4_4_ = fVar214 * fVar214;
          auVar51._0_4_ = fVar208 * fVar208;
          auVar51._8_4_ = fVar215 * fVar215;
          auVar51._12_4_ = fVar216 * fVar216;
          auVar51._16_4_ = fVar217 * fVar217;
          auVar51._20_4_ = fVar218 * fVar218;
          auVar51._24_4_ = fVar219 * fVar219;
          auVar51._28_4_ = uStack_268._4_4_;
          auVar107 = vfmadd231ps_fma(auVar51,auVar110,auVar110);
          local_580 = ZEXT1632(auVar12);
          auVar197 = vmaxps_avx(local_580,ZEXT1632(auVar18));
          fVar208 = auVar197._0_4_ * auVar197._0_4_;
          fVar214 = auVar197._4_4_ * auVar197._4_4_;
          fVar215 = auVar197._8_4_ * auVar197._8_4_;
          fVar216 = auVar197._12_4_ * auVar197._12_4_;
          fVar217 = auVar197._16_4_ * auVar197._16_4_;
          fVar218 = auVar197._20_4_ * auVar197._20_4_;
          fVar219 = auVar197._24_4_ * auVar197._24_4_;
          auVar212 = ZEXT3264(CONCAT428(auVar197._28_4_,
                                        CONCAT424(fVar219,CONCAT420(fVar218,CONCAT416(fVar217,
                                                  CONCAT412(fVar216,CONCAT48(fVar215,CONCAT44(
                                                  fVar214,fVar208))))))));
          auVar202._0_4_ = fVar208 * auVar107._0_4_;
          auVar202._4_4_ = fVar214 * auVar107._4_4_;
          auVar202._8_4_ = fVar215 * auVar107._8_4_;
          auVar202._12_4_ = fVar216 * auVar107._12_4_;
          auVar202._16_4_ = fVar217 * 0.0;
          auVar202._20_4_ = fVar218 * 0.0;
          auVar202._24_4_ = fVar219 * 0.0;
          auVar202._28_4_ = 0;
          auVar52._4_4_ = auVar156._4_4_ * auVar156._4_4_;
          auVar52._0_4_ = auVar156._0_4_ * auVar156._0_4_;
          auVar52._8_4_ = auVar156._8_4_ * auVar156._8_4_;
          auVar52._12_4_ = auVar156._12_4_ * auVar156._12_4_;
          auVar52._16_4_ = auVar156._16_4_ * auVar156._16_4_;
          auVar52._20_4_ = auVar156._20_4_ * auVar156._20_4_;
          auVar52._24_4_ = auVar156._24_4_ * auVar156._24_4_;
          auVar52._28_4_ = auVar156._28_4_;
          auVar197 = vcmpps_avx(auVar52,auVar202,2);
          local_3a0 = (int)lVar100;
          auVar203._4_4_ = local_3a0;
          auVar203._0_4_ = local_3a0;
          auVar203._8_4_ = local_3a0;
          auVar203._12_4_ = local_3a0;
          auVar203._16_4_ = local_3a0;
          auVar203._20_4_ = local_3a0;
          auVar203._24_4_ = local_3a0;
          auVar203._28_4_ = local_3a0;
          auVar156 = vpor_avx2(auVar203,_DAT_01fe9900);
          auVar24 = vpcmpgtd_avx2(local_480,auVar156);
          auVar156 = auVar24 & auVar197;
          if ((((((((auVar156 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar156 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar156 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar156 >> 0x7f,0) == '\0') &&
                (auVar156 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar156 >> 0xbf,0) == '\0') &&
              (auVar156 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar156[0x1f]) {
            auVar141 = ZEXT3264(local_720);
          }
          else {
            local_4a0 = vandps_avx(auVar24,auVar197);
            auVar53._4_4_ = (float)local_700._4_4_ * fVar85;
            auVar53._0_4_ = (float)local_700._0_4_ * fVar84;
            auVar53._8_4_ = fStack_6f8 * fVar86;
            auVar53._12_4_ = fStack_6f4 * fVar87;
            auVar53._16_4_ = fStack_6f0 * fVar88;
            auVar53._20_4_ = fStack_6ec * fVar89;
            auVar53._24_4_ = fStack_6e8 * fVar90;
            auVar53._28_4_ = auVar197._28_4_;
            auVar12 = vfmadd213ps_fma(auVar7,local_760,auVar53);
            auVar12 = vfmadd213ps_fma(auVar221,local_740,ZEXT1632(auVar12));
            auVar12 = vfmadd213ps_fma(auVar132,local_7a0,ZEXT1632(auVar12));
            local_5c0._0_4_ = auVar94._0_4_;
            local_5c0._4_4_ = auVar94._4_4_;
            fStack_5b8 = auVar94._8_4_;
            fStack_5b4 = auVar94._12_4_;
            fStack_5b0 = auVar94._16_4_;
            fStack_5ac = auVar94._20_4_;
            fStack_5a8 = auVar94._24_4_;
            auVar54._4_4_ = (float)local_700._4_4_ * (float)local_5c0._4_4_;
            auVar54._0_4_ = (float)local_700._0_4_ * (float)local_5c0._0_4_;
            auVar54._8_4_ = fStack_6f8 * fStack_5b8;
            auVar54._12_4_ = fStack_6f4 * fStack_5b4;
            auVar54._16_4_ = fStack_6f0 * fStack_5b0;
            auVar54._20_4_ = fStack_6ec * fStack_5ac;
            auVar54._24_4_ = fStack_6e8 * fStack_5a8;
            auVar54._28_4_ = auVar197._28_4_;
            auVar107 = vfmadd213ps_fma(auVar116,local_760,auVar54);
            auVar107 = vfmadd213ps_fma(auVar117,local_740,ZEXT1632(auVar107));
            auVar117 = *(undefined1 (*) [32])(lVar25 + 0x21ab4f4 + lVar100 * 4);
            auVar116 = *(undefined1 (*) [32])(lVar25 + 0x21ab978 + lVar100 * 4);
            auVar132 = *(undefined1 (*) [32])(lVar25 + 0x21abdfc + lVar100 * 4);
            pfVar3 = (float *)(lVar25 + 0x21ac280 + lVar100 * 4);
            fVar208 = *pfVar3;
            fVar214 = pfVar3[1];
            fVar215 = pfVar3[2];
            fVar216 = pfVar3[3];
            fVar217 = pfVar3[4];
            fVar218 = pfVar3[5];
            fVar219 = pfVar3[6];
            auVar55._4_4_ = fVar214 * fStack_51c;
            auVar55._0_4_ = fVar208 * local_520;
            auVar55._8_4_ = fVar215 * fStack_518;
            auVar55._12_4_ = fVar216 * fStack_514;
            auVar55._16_4_ = fVar217 * fStack_510;
            auVar55._20_4_ = fVar218 * fStack_50c;
            auVar55._24_4_ = fVar219 * fStack_508;
            auVar55._28_4_ = local_760._28_4_;
            auVar56._4_4_ = local_280._4_4_ * fVar214;
            auVar56._0_4_ = (float)local_280 * fVar208;
            auVar56._8_4_ = (float)uStack_278 * fVar215;
            auVar56._12_4_ = uStack_278._4_4_ * fVar216;
            auVar56._16_4_ = (float)uStack_270 * fVar217;
            auVar56._20_4_ = uStack_270._4_4_ * fVar218;
            auVar56._24_4_ = (float)uStack_268 * fVar219;
            auVar56._28_4_ = auVar23._28_4_;
            auVar57._4_4_ = (float)local_700._4_4_ * fVar214;
            auVar57._0_4_ = (float)local_700._0_4_ * fVar208;
            auVar57._8_4_ = fStack_6f8 * fVar215;
            auVar57._12_4_ = fStack_6f4 * fVar216;
            auVar57._16_4_ = fStack_6f0 * fVar217;
            auVar57._20_4_ = fStack_6ec * fVar218;
            auVar57._24_4_ = fStack_6e8 * fVar219;
            auVar57._28_4_ = pfVar3[7];
            auVar106 = vfmadd231ps_fma(auVar55,auVar132,local_720);
            auVar143 = vfmadd231ps_fma(auVar56,auVar132,local_6c0);
            auVar126 = vfmadd231ps_fma(auVar57,local_760,auVar132);
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar116,auVar172);
            auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar116,local_560);
            auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),local_740,auVar116);
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar117,auVar227);
            auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar117,local_540);
            auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),local_7a0,auVar117);
            pfVar3 = (float *)(lVar25 + 0x21ae6a0 + lVar100 * 4);
            fVar208 = *pfVar3;
            fVar214 = pfVar3[1];
            fVar215 = pfVar3[2];
            fVar216 = pfVar3[3];
            fVar217 = pfVar3[4];
            fVar218 = pfVar3[5];
            fVar219 = pfVar3[6];
            auVar58._4_4_ = fStack_51c * fVar214;
            auVar58._0_4_ = local_520 * fVar208;
            auVar58._8_4_ = fStack_518 * fVar215;
            auVar58._12_4_ = fStack_514 * fVar216;
            auVar58._16_4_ = fStack_510 * fVar217;
            auVar58._20_4_ = fStack_50c * fVar218;
            auVar58._24_4_ = fStack_508 * fVar219;
            auVar58._28_4_ = uStack_6e4;
            auVar59._4_4_ = local_280._4_4_ * fVar214;
            auVar59._0_4_ = (float)local_280 * fVar208;
            auVar59._8_4_ = (float)uStack_278 * fVar215;
            auVar59._12_4_ = uStack_278._4_4_ * fVar216;
            auVar59._16_4_ = (float)uStack_270 * fVar217;
            auVar59._20_4_ = uStack_270._4_4_ * fVar218;
            auVar59._24_4_ = (float)uStack_268 * fVar219;
            auVar59._28_4_ = local_7a0._28_4_;
            auVar60._4_4_ = fVar214 * (float)local_700._4_4_;
            auVar60._0_4_ = fVar208 * (float)local_700._0_4_;
            auVar60._8_4_ = fVar215 * fStack_6f8;
            auVar60._12_4_ = fVar216 * fStack_6f4;
            auVar60._16_4_ = fVar217 * fStack_6f0;
            auVar60._20_4_ = fVar218 * fStack_6ec;
            auVar60._24_4_ = fVar219 * fStack_6e8;
            auVar60._28_4_ = pfVar3[7];
            auVar117 = *(undefined1 (*) [32])(lVar25 + 0x21ae21c + lVar100 * 4);
            auVar105 = vfmadd231ps_fma(auVar58,auVar117,local_720);
            auVar127 = vfmadd231ps_fma(auVar59,auVar117,local_6c0);
            auVar160 = vfmadd231ps_fma(auVar60,auVar117,local_760);
            auVar117 = *(undefined1 (*) [32])(lVar25 + 0x21add98 + lVar100 * 4);
            auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar117,auVar172);
            auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar117,local_560);
            auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar117,local_740);
            auVar117 = *(undefined1 (*) [32])(lVar25 + 0x21ad914 + lVar100 * 4);
            auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar117,auVar227);
            auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar117,local_540);
            auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),local_7a0,auVar117);
            auVar204._8_4_ = 0x7fffffff;
            auVar204._0_8_ = 0x7fffffff7fffffff;
            auVar204._12_4_ = 0x7fffffff;
            auVar204._16_4_ = 0x7fffffff;
            auVar204._20_4_ = 0x7fffffff;
            auVar204._24_4_ = 0x7fffffff;
            auVar204._28_4_ = 0x7fffffff;
            auVar117 = vandps_avx(ZEXT1632(auVar106),auVar204);
            auVar116 = vandps_avx(ZEXT1632(auVar143),auVar204);
            auVar116 = vmaxps_avx(auVar117,auVar116);
            auVar117 = vandps_avx(ZEXT1632(auVar126),auVar204);
            auVar117 = vmaxps_avx(auVar116,auVar117);
            auVar117 = vcmpps_avx(auVar117,_local_4c0,1);
            auVar132 = vblendvps_avx(ZEXT1632(auVar106),auVar110,auVar117);
            auVar221 = vblendvps_avx(ZEXT1632(auVar143),auVar23,auVar117);
            auVar117 = vandps_avx(ZEXT1632(auVar105),auVar204);
            auVar116 = vandps_avx(ZEXT1632(auVar127),auVar204);
            auVar116 = vmaxps_avx(auVar117,auVar116);
            auVar117 = vandps_avx(auVar204,ZEXT1632(auVar160));
            auVar117 = vmaxps_avx(auVar116,auVar117);
            auVar116 = vcmpps_avx(auVar117,_local_4c0,1);
            auVar117 = vblendvps_avx(ZEXT1632(auVar105),auVar110,auVar116);
            auVar116 = vblendvps_avx(ZEXT1632(auVar127),auVar23,auVar116);
            auVar107 = vfmadd213ps_fma(auVar109,local_7a0,ZEXT1632(auVar107));
            auVar106 = vfmadd213ps_fma(auVar132,auVar132,ZEXT832(0) << 0x20);
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar221,auVar221);
            auVar109 = vrsqrtps_avx(ZEXT1632(auVar106));
            fVar208 = auVar109._0_4_;
            fVar214 = auVar109._4_4_;
            fVar215 = auVar109._8_4_;
            fVar216 = auVar109._12_4_;
            fVar217 = auVar109._16_4_;
            fVar218 = auVar109._20_4_;
            fVar219 = auVar109._24_4_;
            auVar61._4_4_ = fVar214 * fVar214 * fVar214 * auVar106._4_4_ * -0.5;
            auVar61._0_4_ = fVar208 * fVar208 * fVar208 * auVar106._0_4_ * -0.5;
            auVar61._8_4_ = fVar215 * fVar215 * fVar215 * auVar106._8_4_ * -0.5;
            auVar61._12_4_ = fVar216 * fVar216 * fVar216 * auVar106._12_4_ * -0.5;
            auVar61._16_4_ = fVar217 * fVar217 * fVar217 * -0.0;
            auVar61._20_4_ = fVar218 * fVar218 * fVar218 * -0.0;
            auVar61._24_4_ = fVar219 * fVar219 * fVar219 * -0.0;
            auVar61._28_4_ = 0;
            auVar229._8_4_ = 0x3fc00000;
            auVar229._0_8_ = 0x3fc000003fc00000;
            auVar229._12_4_ = 0x3fc00000;
            auVar229._16_4_ = 0x3fc00000;
            auVar229._20_4_ = 0x3fc00000;
            auVar229._24_4_ = 0x3fc00000;
            auVar229._28_4_ = 0x3fc00000;
            auVar106 = vfmadd231ps_fma(auVar61,auVar229,auVar109);
            fVar208 = auVar106._0_4_;
            fVar214 = auVar106._4_4_;
            auVar62._4_4_ = auVar221._4_4_ * fVar214;
            auVar62._0_4_ = auVar221._0_4_ * fVar208;
            fVar215 = auVar106._8_4_;
            auVar62._8_4_ = auVar221._8_4_ * fVar215;
            fVar216 = auVar106._12_4_;
            auVar62._12_4_ = auVar221._12_4_ * fVar216;
            auVar62._16_4_ = auVar221._16_4_ * 0.0;
            auVar62._20_4_ = auVar221._20_4_ * 0.0;
            auVar62._24_4_ = auVar221._24_4_ * 0.0;
            auVar62._28_4_ = auVar109._28_4_;
            auVar63._4_4_ = fVar214 * -auVar132._4_4_;
            auVar63._0_4_ = fVar208 * -auVar132._0_4_;
            auVar63._8_4_ = fVar215 * -auVar132._8_4_;
            auVar63._12_4_ = fVar216 * -auVar132._12_4_;
            auVar63._16_4_ = -auVar132._16_4_ * 0.0;
            auVar63._20_4_ = -auVar132._20_4_ * 0.0;
            auVar63._24_4_ = -auVar132._24_4_ * 0.0;
            auVar63._28_4_ = auVar221._28_4_;
            auVar106 = vfmadd213ps_fma(auVar117,auVar117,ZEXT832(0) << 0x20);
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar116,auVar116);
            auVar109 = vrsqrtps_avx(ZEXT1632(auVar106));
            auVar64._28_4_ = fStack_504;
            auVar64._0_28_ =
                 ZEXT1628(CONCAT412(fVar216 * 0.0,
                                    CONCAT48(fVar215 * 0.0,CONCAT44(fVar214 * 0.0,fVar208 * 0.0))));
            fVar208 = auVar109._0_4_;
            fVar214 = auVar109._4_4_;
            fVar215 = auVar109._8_4_;
            fVar216 = auVar109._12_4_;
            fVar217 = auVar109._16_4_;
            fVar218 = auVar109._20_4_;
            fVar219 = auVar109._24_4_;
            auVar65._4_4_ = fVar214 * fVar214 * fVar214 * auVar106._4_4_ * -0.5;
            auVar65._0_4_ = fVar208 * fVar208 * fVar208 * auVar106._0_4_ * -0.5;
            auVar65._8_4_ = fVar215 * fVar215 * fVar215 * auVar106._8_4_ * -0.5;
            auVar65._12_4_ = fVar216 * fVar216 * fVar216 * auVar106._12_4_ * -0.5;
            auVar65._16_4_ = fVar217 * fVar217 * fVar217 * -0.0;
            auVar65._20_4_ = fVar218 * fVar218 * fVar218 * -0.0;
            auVar65._24_4_ = fVar219 * fVar219 * fVar219 * -0.0;
            auVar65._28_4_ = 0;
            auVar106 = vfmadd231ps_fma(auVar65,auVar229,auVar109);
            fVar208 = auVar106._0_4_;
            auVar224._0_4_ = auVar116._0_4_ * fVar208;
            fVar214 = auVar106._4_4_;
            auVar224._4_4_ = auVar116._4_4_ * fVar214;
            fVar215 = auVar106._8_4_;
            auVar224._8_4_ = auVar116._8_4_ * fVar215;
            fVar216 = auVar106._12_4_;
            auVar224._12_4_ = auVar116._12_4_ * fVar216;
            auVar224._16_4_ = auVar116._16_4_ * 0.0;
            auVar224._20_4_ = auVar116._20_4_ * 0.0;
            auVar224._24_4_ = auVar116._24_4_ * 0.0;
            auVar224._28_4_ = 0;
            auVar66._4_4_ = fVar214 * -auVar117._4_4_;
            auVar66._0_4_ = fVar208 * -auVar117._0_4_;
            auVar66._8_4_ = fVar215 * -auVar117._8_4_;
            auVar66._12_4_ = fVar216 * -auVar117._12_4_;
            auVar66._16_4_ = -auVar117._16_4_ * 0.0;
            auVar66._20_4_ = -auVar117._20_4_ * 0.0;
            auVar66._24_4_ = -auVar117._24_4_ * 0.0;
            auVar66._28_4_ = auVar109._28_4_;
            auVar67._28_4_ = 0xbf000000;
            auVar67._0_28_ =
                 ZEXT1628(CONCAT412(fVar216 * 0.0,
                                    CONCAT48(fVar215 * 0.0,CONCAT44(fVar214 * 0.0,fVar208 * 0.0))));
            auVar106 = vfmadd213ps_fma(auVar62,local_580,local_6e0);
            auVar143 = vfmadd213ps_fma(auVar63,local_580,local_460);
            auVar126 = vfmadd213ps_fma(auVar64,local_580,ZEXT1632(auVar107));
            auVar168 = vfnmadd213ps_fma(auVar62,local_580,local_6e0);
            auVar105 = vfmadd213ps_fma(auVar224,ZEXT1632(auVar18),local_440);
            auVar104 = vfnmadd213ps_fma(auVar63,local_580,local_460);
            auVar109 = ZEXT1632(auVar18);
            auVar127 = vfmadd213ps_fma(auVar66,auVar109,local_620);
            auVar177 = vfnmadd231ps_fma(ZEXT1632(auVar107),local_580,auVar64);
            auVar107 = vfmadd213ps_fma(auVar67,auVar109,ZEXT1632(auVar12));
            auVar125 = vfnmadd213ps_fma(auVar224,auVar109,local_440);
            auVar167 = vfnmadd213ps_fma(auVar66,auVar109,local_620);
            auVar178 = vfnmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar18),auVar67);
            auVar109 = vsubps_avx(ZEXT1632(auVar127),ZEXT1632(auVar104));
            auVar117 = vsubps_avx(ZEXT1632(auVar107),ZEXT1632(auVar177));
            auVar68._4_4_ = auVar109._4_4_ * auVar177._4_4_;
            auVar68._0_4_ = auVar109._0_4_ * auVar177._0_4_;
            auVar68._8_4_ = auVar109._8_4_ * auVar177._8_4_;
            auVar68._12_4_ = auVar109._12_4_ * auVar177._12_4_;
            auVar68._16_4_ = auVar109._16_4_ * 0.0;
            auVar68._20_4_ = auVar109._20_4_ * 0.0;
            auVar68._24_4_ = auVar109._24_4_ * 0.0;
            auVar68._28_4_ = fStack_504;
            auVar160 = vfmsub231ps_fma(auVar68,ZEXT1632(auVar104),auVar117);
            auVar69._4_4_ = auVar168._4_4_ * auVar117._4_4_;
            auVar69._0_4_ = auVar168._0_4_ * auVar117._0_4_;
            auVar69._8_4_ = auVar168._8_4_ * auVar117._8_4_;
            auVar69._12_4_ = auVar168._12_4_ * auVar117._12_4_;
            auVar69._16_4_ = auVar117._16_4_ * 0.0;
            auVar69._20_4_ = auVar117._20_4_ * 0.0;
            auVar69._24_4_ = auVar117._24_4_ * 0.0;
            auVar69._28_4_ = auVar117._28_4_;
            auVar197 = ZEXT1632(auVar168);
            auVar117 = vsubps_avx(ZEXT1632(auVar105),auVar197);
            auVar156 = ZEXT1632(auVar177);
            auVar12 = vfmsub231ps_fma(auVar69,auVar156,auVar117);
            auVar70._4_4_ = auVar104._4_4_ * auVar117._4_4_;
            auVar70._0_4_ = auVar104._0_4_ * auVar117._0_4_;
            auVar70._8_4_ = auVar104._8_4_ * auVar117._8_4_;
            auVar70._12_4_ = auVar104._12_4_ * auVar117._12_4_;
            auVar70._16_4_ = auVar117._16_4_ * 0.0;
            auVar70._20_4_ = auVar117._20_4_ * 0.0;
            auVar70._24_4_ = auVar117._24_4_ * 0.0;
            auVar70._28_4_ = auVar117._28_4_;
            auVar168 = vfmsub231ps_fma(auVar70,auVar197,auVar109);
            auVar109 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar109,ZEXT1632(auVar12));
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar109,ZEXT1632(auVar160));
            auVar24 = vcmpps_avx(ZEXT1632(auVar12),ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar109 = vblendvps_avx(ZEXT1632(auVar125),ZEXT1632(auVar106),auVar24);
            auVar117 = vblendvps_avx(ZEXT1632(auVar167),ZEXT1632(auVar143),auVar24);
            auVar116 = vblendvps_avx(ZEXT1632(auVar178),ZEXT1632(auVar126),auVar24);
            auVar223 = ZEXT3264(auVar116);
            auVar132 = vblendvps_avx(auVar197,ZEXT1632(auVar105),auVar24);
            auVar221 = vblendvps_avx(ZEXT1632(auVar104),ZEXT1632(auVar127),auVar24);
            auVar7 = vblendvps_avx(auVar156,ZEXT1632(auVar107),auVar24);
            auVar197 = vblendvps_avx(ZEXT1632(auVar105),auVar197,auVar24);
            auVar110 = vblendvps_avx(ZEXT1632(auVar127),ZEXT1632(auVar104),auVar24);
            auVar12 = vpackssdw_avx(local_4a0._0_16_,local_4a0._16_16_);
            auVar156 = vblendvps_avx(ZEXT1632(auVar107),auVar156,auVar24);
            auVar197 = vsubps_avx(auVar197,auVar109);
            auVar110 = vsubps_avx(auVar110,auVar117);
            auVar22 = vsubps_avx(auVar156,auVar116);
            auVar111 = vsubps_avx(auVar109,auVar132);
            auVar128 = vsubps_avx(auVar117,auVar221);
            auVar212 = ZEXT3264(auVar128);
            auVar163 = vsubps_avx(auVar116,auVar7);
            auVar185._0_4_ = auVar22._0_4_ * auVar109._0_4_;
            auVar185._4_4_ = auVar22._4_4_ * auVar109._4_4_;
            auVar185._8_4_ = auVar22._8_4_ * auVar109._8_4_;
            auVar185._12_4_ = auVar22._12_4_ * auVar109._12_4_;
            auVar185._16_4_ = auVar22._16_4_ * auVar109._16_4_;
            auVar185._20_4_ = auVar22._20_4_ * auVar109._20_4_;
            auVar185._24_4_ = auVar22._24_4_ * auVar109._24_4_;
            auVar185._28_4_ = 0;
            auVar107 = vfmsub231ps_fma(auVar185,auVar116,auVar197);
            auVar71._4_4_ = auVar197._4_4_ * auVar117._4_4_;
            auVar71._0_4_ = auVar197._0_4_ * auVar117._0_4_;
            auVar71._8_4_ = auVar197._8_4_ * auVar117._8_4_;
            auVar71._12_4_ = auVar197._12_4_ * auVar117._12_4_;
            auVar71._16_4_ = auVar197._16_4_ * auVar117._16_4_;
            auVar71._20_4_ = auVar197._20_4_ * auVar117._20_4_;
            auVar71._24_4_ = auVar197._24_4_ * auVar117._24_4_;
            auVar71._28_4_ = auVar156._28_4_;
            auVar106 = vfmsub231ps_fma(auVar71,auVar109,auVar110);
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT832(0) << 0x20,ZEXT1632(auVar107));
            auVar186._0_4_ = auVar116._0_4_ * auVar110._0_4_;
            auVar186._4_4_ = auVar116._4_4_ * auVar110._4_4_;
            auVar186._8_4_ = auVar116._8_4_ * auVar110._8_4_;
            auVar186._12_4_ = auVar116._12_4_ * auVar110._12_4_;
            auVar186._16_4_ = auVar116._16_4_ * auVar110._16_4_;
            auVar186._20_4_ = auVar116._20_4_ * auVar110._20_4_;
            auVar186._24_4_ = auVar116._24_4_ * auVar110._24_4_;
            auVar186._28_4_ = 0;
            auVar106 = vfmsub231ps_fma(auVar186,auVar117,auVar22);
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT832(0) << 0x20,ZEXT1632(auVar106));
            auVar187._0_4_ = auVar163._0_4_ * auVar132._0_4_;
            auVar187._4_4_ = auVar163._4_4_ * auVar132._4_4_;
            auVar187._8_4_ = auVar163._8_4_ * auVar132._8_4_;
            auVar187._12_4_ = auVar163._12_4_ * auVar132._12_4_;
            auVar187._16_4_ = auVar163._16_4_ * auVar132._16_4_;
            auVar187._20_4_ = auVar163._20_4_ * auVar132._20_4_;
            auVar187._24_4_ = auVar163._24_4_ * auVar132._24_4_;
            auVar187._28_4_ = 0;
            auVar107 = vfmsub231ps_fma(auVar187,auVar111,auVar7);
            auVar72._4_4_ = auVar128._4_4_ * auVar7._4_4_;
            auVar72._0_4_ = auVar128._0_4_ * auVar7._0_4_;
            auVar72._8_4_ = auVar128._8_4_ * auVar7._8_4_;
            auVar72._12_4_ = auVar128._12_4_ * auVar7._12_4_;
            auVar72._16_4_ = auVar128._16_4_ * auVar7._16_4_;
            auVar72._20_4_ = auVar128._20_4_ * auVar7._20_4_;
            auVar72._24_4_ = auVar128._24_4_ * auVar7._24_4_;
            auVar72._28_4_ = auVar7._28_4_;
            auVar143 = vfmsub231ps_fma(auVar72,auVar221,auVar163);
            auVar73._4_4_ = auVar111._4_4_ * auVar221._4_4_;
            auVar73._0_4_ = auVar111._0_4_ * auVar221._0_4_;
            auVar73._8_4_ = auVar111._8_4_ * auVar221._8_4_;
            auVar73._12_4_ = auVar111._12_4_ * auVar221._12_4_;
            auVar73._16_4_ = auVar111._16_4_ * auVar221._16_4_;
            auVar73._20_4_ = auVar111._20_4_ * auVar221._20_4_;
            auVar73._24_4_ = auVar111._24_4_ * auVar221._24_4_;
            auVar73._28_4_ = auVar221._28_4_;
            auVar126 = vfmsub231ps_fma(auVar73,auVar128,auVar132);
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar126),ZEXT832(0) << 0x20,ZEXT1632(auVar107));
            auVar143 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT832(0) << 0x20,ZEXT1632(auVar143));
            auVar132 = vmaxps_avx(ZEXT1632(auVar106),ZEXT1632(auVar143));
            auVar132 = vcmpps_avx(auVar132,ZEXT832(0) << 0x20,2);
            auVar107 = vpackssdw_avx(auVar132._0_16_,auVar132._16_16_);
            auVar12 = vpand_avx(auVar107,auVar12);
            auVar132 = vpmovsxwd_avx2(auVar12);
            if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar132 >> 0x7f,0) == '\0') &&
                  (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar132 >> 0xbf,0) == '\0') &&
                (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar132[0x1f]) {
LAB_015a04a7:
              auVar165._8_8_ = local_680[1]._8_8_;
              auVar165._0_8_ = local_680[1]._0_8_;
              auVar165._16_8_ = local_680[1]._16_8_;
              auVar165._24_8_ = local_680[1]._24_8_;
            }
            else {
              auVar74._4_4_ = auVar163._4_4_ * auVar110._4_4_;
              auVar74._0_4_ = auVar163._0_4_ * auVar110._0_4_;
              auVar74._8_4_ = auVar163._8_4_ * auVar110._8_4_;
              auVar74._12_4_ = auVar163._12_4_ * auVar110._12_4_;
              auVar74._16_4_ = auVar163._16_4_ * auVar110._16_4_;
              auVar74._20_4_ = auVar163._20_4_ * auVar110._20_4_;
              auVar74._24_4_ = auVar163._24_4_ * auVar110._24_4_;
              auVar74._28_4_ = auVar132._28_4_;
              auVar127 = vfmsub231ps_fma(auVar74,auVar128,auVar22);
              auVar191._0_4_ = auVar22._0_4_ * auVar111._0_4_;
              auVar191._4_4_ = auVar22._4_4_ * auVar111._4_4_;
              auVar191._8_4_ = auVar22._8_4_ * auVar111._8_4_;
              auVar191._12_4_ = auVar22._12_4_ * auVar111._12_4_;
              auVar191._16_4_ = auVar22._16_4_ * auVar111._16_4_;
              auVar191._20_4_ = auVar22._20_4_ * auVar111._20_4_;
              auVar191._24_4_ = auVar22._24_4_ * auVar111._24_4_;
              auVar191._28_4_ = 0;
              auVar105 = vfmsub231ps_fma(auVar191,auVar197,auVar163);
              auVar75._4_4_ = auVar197._4_4_ * auVar128._4_4_;
              auVar75._0_4_ = auVar197._0_4_ * auVar128._0_4_;
              auVar75._8_4_ = auVar197._8_4_ * auVar128._8_4_;
              auVar75._12_4_ = auVar197._12_4_ * auVar128._12_4_;
              auVar75._16_4_ = auVar197._16_4_ * auVar128._16_4_;
              auVar75._20_4_ = auVar197._20_4_ * auVar128._20_4_;
              auVar75._24_4_ = auVar197._24_4_ * auVar128._24_4_;
              auVar75._28_4_ = auVar128._28_4_;
              auVar160 = vfmsub231ps_fma(auVar75,auVar111,auVar110);
              auVar212 = ZEXT1664(auVar160);
              auVar107 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar105),ZEXT1632(auVar160));
              auVar126 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT1632(auVar127),ZEXT832(0) << 0x20);
              auVar132 = vrcpps_avx(ZEXT1632(auVar126));
              auVar222._8_4_ = 0x3f800000;
              auVar222._0_8_ = 0x3f8000003f800000;
              auVar222._12_4_ = 0x3f800000;
              auVar222._16_4_ = 0x3f800000;
              auVar222._20_4_ = 0x3f800000;
              auVar222._24_4_ = 0x3f800000;
              auVar222._28_4_ = 0x3f800000;
              auVar223 = ZEXT3264(auVar222);
              auVar107 = vfnmadd213ps_fma(auVar132,ZEXT1632(auVar126),auVar222);
              auVar107 = vfmadd132ps_fma(ZEXT1632(auVar107),auVar132,auVar132);
              auVar76._4_4_ = auVar160._4_4_ * auVar116._4_4_;
              auVar76._0_4_ = auVar160._0_4_ * auVar116._0_4_;
              auVar76._8_4_ = auVar160._8_4_ * auVar116._8_4_;
              auVar76._12_4_ = auVar160._12_4_ * auVar116._12_4_;
              auVar76._16_4_ = auVar116._16_4_ * 0.0;
              auVar76._20_4_ = auVar116._20_4_ * 0.0;
              auVar76._24_4_ = auVar116._24_4_ * 0.0;
              auVar76._28_4_ = auVar110._28_4_;
              auVar105 = vfmadd231ps_fma(auVar76,auVar117,ZEXT1632(auVar105));
              auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),ZEXT1632(auVar127),auVar109);
              fVar208 = auVar107._0_4_;
              fVar214 = auVar107._4_4_;
              fVar215 = auVar107._8_4_;
              fVar216 = auVar107._12_4_;
              auVar116 = ZEXT1632(CONCAT412(fVar216 * auVar105._12_4_,
                                            CONCAT48(fVar215 * auVar105._8_4_,
                                                     CONCAT44(fVar214 * auVar105._4_4_,
                                                              fVar208 * auVar105._0_4_))));
              uVar102 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar164._4_4_ = uVar102;
              auVar164._0_4_ = uVar102;
              auVar164._8_4_ = uVar102;
              auVar164._12_4_ = uVar102;
              auVar164._16_4_ = uVar102;
              auVar164._20_4_ = uVar102;
              auVar164._24_4_ = uVar102;
              auVar164._28_4_ = uVar102;
              auVar93._4_4_ = uStack_63c;
              auVar93._0_4_ = local_640;
              auVar93._8_4_ = uStack_638;
              auVar93._12_4_ = uStack_634;
              auVar93._16_4_ = uStack_630;
              auVar93._20_4_ = uStack_62c;
              auVar93._24_4_ = uStack_628;
              auVar93._28_4_ = uStack_624;
              auVar109 = vcmpps_avx(auVar93,auVar116,2);
              auVar117 = vcmpps_avx(auVar116,auVar164,2);
              auVar109 = vandps_avx(auVar117,auVar109);
              auVar107 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
              auVar12 = vpand_avx(auVar12,auVar107);
              auVar109 = vpmovsxwd_avx2(auVar12);
              if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar109 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar109 >> 0x7f,0) == '\0') &&
                    (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar109 >> 0xbf,0) == '\0') &&
                  (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar109[0x1f]) goto LAB_015a04a7;
              auVar109 = vcmpps_avx(ZEXT1632(auVar126),ZEXT832(0) << 0x20,4);
              auVar107 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
              auVar12 = vpand_avx(auVar12,auVar107);
              auVar109 = vpmovsxwd_avx2(auVar12);
              auVar165._8_8_ = local_680[1]._8_8_;
              auVar165._0_8_ = local_680[1]._0_8_;
              auVar165._16_8_ = local_680[1]._16_8_;
              auVar165._24_8_ = local_680[1]._24_8_;
              if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar109 >> 0x7f,0) != '\0') ||
                    (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar109 >> 0xbf,0) != '\0') ||
                  (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar109[0x1f] < '\0') {
                auVar132 = ZEXT1632(CONCAT412(fVar216 * auVar106._12_4_,
                                              CONCAT48(fVar215 * auVar106._8_4_,
                                                       CONCAT44(fVar214 * auVar106._4_4_,
                                                                fVar208 * auVar106._0_4_))));
                auVar77._28_4_ = SUB84(local_680[1]._24_8_,4);
                auVar77._0_28_ =
                     ZEXT1628(CONCAT412(fVar216 * auVar143._12_4_,
                                        CONCAT48(fVar215 * auVar143._8_4_,
                                                 CONCAT44(fVar214 * auVar143._4_4_,
                                                          fVar208 * auVar143._0_4_))));
                auVar198._8_4_ = 0x3f800000;
                auVar198._0_8_ = 0x3f8000003f800000;
                auVar198._12_4_ = 0x3f800000;
                auVar198._16_4_ = 0x3f800000;
                auVar198._20_4_ = 0x3f800000;
                auVar198._24_4_ = 0x3f800000;
                auVar198._28_4_ = 0x3f800000;
                auVar117 = vsubps_avx(auVar198,auVar132);
                local_100 = vblendvps_avx(auVar117,auVar132,auVar24);
                auVar117 = vsubps_avx(auVar198,auVar77);
                local_500 = vblendvps_avx(auVar117,auVar77,auVar24);
                auVar165 = auVar109;
                local_600 = auVar116;
              }
            }
            if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar165 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar165 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar165 >> 0x7f,0) == '\0') &&
                  (auVar165 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar165 >> 0xbf,0) == '\0') &&
                (auVar165 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar165[0x1f]) {
              auVar141 = ZEXT3264(local_720);
            }
            else {
              auVar109 = vsubps_avx(ZEXT1632(auVar18),local_580);
              auVar12 = vfmadd213ps_fma(auVar109,local_100,local_580);
              fVar208 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar78._4_4_ = (auVar12._4_4_ + auVar12._4_4_) * fVar208;
              auVar78._0_4_ = (auVar12._0_4_ + auVar12._0_4_) * fVar208;
              auVar78._8_4_ = (auVar12._8_4_ + auVar12._8_4_) * fVar208;
              auVar78._12_4_ = (auVar12._12_4_ + auVar12._12_4_) * fVar208;
              auVar78._16_4_ = fVar208 * 0.0;
              auVar78._20_4_ = fVar208 * 0.0;
              auVar78._24_4_ = fVar208 * 0.0;
              auVar78._28_4_ = fVar208;
              auVar109 = vcmpps_avx(local_600,auVar78,6);
              auVar117 = auVar165 & auVar109;
              if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar117 >> 0x7f,0) != '\0') ||
                    (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar117 >> 0xbf,0) != '\0') ||
                  (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar117[0x1f] < '\0') {
                auVar135._8_4_ = 0xbf800000;
                auVar135._0_8_ = 0xbf800000bf800000;
                auVar135._12_4_ = 0xbf800000;
                auVar135._16_4_ = 0xbf800000;
                auVar135._20_4_ = 0xbf800000;
                auVar135._24_4_ = 0xbf800000;
                auVar135._28_4_ = 0xbf800000;
                auVar157._8_4_ = 0x40000000;
                auVar157._0_8_ = 0x4000000040000000;
                auVar157._12_4_ = 0x40000000;
                auVar157._16_4_ = 0x40000000;
                auVar157._20_4_ = 0x40000000;
                auVar157._24_4_ = 0x40000000;
                auVar157._28_4_ = 0x40000000;
                auVar12 = vfmadd213ps_fma(local_500,auVar157,auVar135);
                local_400 = local_100;
                local_3e0 = ZEXT1632(auVar12);
                local_3c0 = local_600;
                local_380 = local_850;
                uStack_378 = uStack_848;
                local_370 = local_860;
                uStack_368 = uStack_858;
                local_360 = local_870;
                uStack_358 = uStack_868;
                pGVar9 = (context->scene->geometries).items[(uint)local_8a0._4_4_].ptr;
                local_500 = local_3e0;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  local_6a0 = vandps_avx(auVar109,auVar165);
                  auVar212 = ZEXT1264(ZEXT812(0));
                  fVar208 = (float)local_3a0;
                  local_320[0] = (fVar208 + local_100._0_4_ + 0.0) * local_140;
                  local_320[1] = (fVar208 + local_100._4_4_ + 1.0) * fStack_13c;
                  local_320[2] = (fVar208 + local_100._8_4_ + 2.0) * fStack_138;
                  local_320[3] = (fVar208 + local_100._12_4_ + 3.0) * fStack_134;
                  fStack_310 = (fVar208 + local_100._16_4_ + 4.0) * fStack_130;
                  fStack_30c = (fVar208 + local_100._20_4_ + 5.0) * fStack_12c;
                  fStack_308 = (fVar208 + local_100._24_4_ + 6.0) * fStack_128;
                  fStack_304 = fVar208 + local_100._28_4_ + 7.0;
                  local_500._0_8_ = auVar12._0_8_;
                  local_500._8_8_ = auVar12._8_8_;
                  local_300 = local_500._0_8_;
                  uStack_2f8 = local_500._8_8_;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  local_2e0 = local_600;
                  auVar136._8_4_ = 0x7f800000;
                  auVar136._0_8_ = 0x7f8000007f800000;
                  auVar136._12_4_ = 0x7f800000;
                  auVar136._16_4_ = 0x7f800000;
                  auVar136._20_4_ = 0x7f800000;
                  auVar136._24_4_ = 0x7f800000;
                  auVar136._28_4_ = 0x7f800000;
                  auVar109 = vblendvps_avx(auVar136,local_600,local_6a0);
                  auVar117 = vshufps_avx(auVar109,auVar109,0xb1);
                  auVar117 = vminps_avx(auVar109,auVar117);
                  auVar116 = vshufpd_avx(auVar117,auVar117,5);
                  auVar117 = vminps_avx(auVar117,auVar116);
                  auVar116 = vpermpd_avx2(auVar117,0x4e);
                  auVar117 = vminps_avx(auVar117,auVar116);
                  auVar117 = vcmpps_avx(auVar109,auVar117,0);
                  auVar116 = local_6a0 & auVar117;
                  auVar109 = local_6a0;
                  if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar116 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar116 >> 0x7f,0) != '\0') ||
                        (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar116 >> 0xbf,0) != '\0') ||
                      (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar116[0x1f] < '\0') {
                    auVar109 = vandps_avx(auVar117,local_6a0);
                  }
                  uVar96 = vmovmskps_avx(auVar109);
                  uVar98 = 0;
                  for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
                    uVar98 = uVar98 + 1;
                  }
                  uVar97 = (ulong)uVar98;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar208 = local_320[uVar97];
                    uVar102 = *(undefined4 *)((long)&local_300 + uVar97 * 4);
                    fVar215 = 1.0 - fVar208;
                    fVar214 = fVar215 * fVar215 * -3.0;
                    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar215 * fVar215)),
                                              ZEXT416((uint)(fVar208 * fVar215)),ZEXT416(0xc0000000)
                                             );
                    auVar18 = vfmsub132ss_fma(ZEXT416((uint)(fVar208 * fVar215)),
                                              ZEXT416((uint)(fVar208 * fVar208)),ZEXT416(0x40000000)
                                             );
                    fVar215 = auVar12._0_4_ * 3.0;
                    fVar216 = auVar18._0_4_ * 3.0;
                    fVar217 = fVar208 * fVar208 * 3.0;
                    auVar181._0_4_ = fVar217 * fVar120;
                    auVar181._4_4_ = fVar217 * fVar121;
                    auVar181._8_4_ = fVar217 * fVar122;
                    auVar181._12_4_ = fVar217 * fVar14;
                    auVar146._4_4_ = fVar216;
                    auVar146._0_4_ = fVar216;
                    auVar146._8_4_ = fVar216;
                    auVar146._12_4_ = fVar216;
                    auVar12 = vfmadd132ps_fma(auVar146,auVar181,auVar17);
                    auVar162._4_4_ = fVar215;
                    auVar162._0_4_ = fVar215;
                    auVar162._8_4_ = fVar215;
                    auVar162._12_4_ = fVar215;
                    auVar12 = vfmadd132ps_fma(auVar162,auVar12,auVar16);
                    auVar147._4_4_ = fVar214;
                    auVar147._0_4_ = fVar214;
                    auVar147._8_4_ = fVar214;
                    auVar147._12_4_ = fVar214;
                    auVar12 = vfmadd132ps_fma(auVar147,auVar12,auVar13);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + uVar97 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar12._0_4_;
                    uVar199 = vextractps_avx(auVar12,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar199;
                    uVar199 = vextractps_avx(auVar12,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar199;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar208;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar102;
                    *(undefined4 *)(ray + k * 4 + 0x220) = uVar4;
                    *(undefined4 *)(ray + k * 4 + 0x240) = local_8a0._4_4_;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    uVar102 = *(undefined4 *)(ray + k * 4 + 0x100);
                    _local_5c0 = auVar23;
                    local_39c = iVar95;
                    local_390 = uVar91;
                    uStack_388 = uVar92;
                    while( true ) {
                      local_200 = local_320[uVar97];
                      local_1e0 = *(undefined4 *)((long)&local_300 + uVar97 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + uVar97 * 4)
                      ;
                      fVar215 = 1.0 - local_200;
                      auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar215 * fVar215)),
                                                ZEXT416((uint)(local_200 * fVar215)),
                                                ZEXT416(0xc0000000));
                      auVar12 = vfmsub132ss_fma(ZEXT416((uint)(local_200 * fVar215)),
                                                ZEXT416((uint)(local_200 * local_200)),
                                                ZEXT416(0x40000000));
                      fVar208 = auVar12._0_4_ * 3.0;
                      fVar214 = local_200 * local_200 * 3.0;
                      auVar182._0_4_ = fVar214 * fVar120;
                      auVar182._4_4_ = fVar214 * fVar121;
                      auVar182._8_4_ = fVar214 * fVar122;
                      auVar182._12_4_ = fVar214 * fVar14;
                      auVar148._4_4_ = fVar208;
                      auVar148._0_4_ = fVar208;
                      auVar148._8_4_ = fVar208;
                      auVar148._12_4_ = fVar208;
                      auVar12 = vfmadd132ps_fma(auVar148,auVar182,auVar17);
                      fVar208 = auVar18._0_4_ * 3.0;
                      auVar170._4_4_ = fVar208;
                      auVar170._0_4_ = fVar208;
                      auVar170._8_4_ = fVar208;
                      auVar170._12_4_ = fVar208;
                      auVar12 = vfmadd132ps_fma(auVar170,auVar12,auVar16);
                      fVar208 = fVar215 * fVar215 * -3.0;
                      local_7d0.context = context->user;
                      auVar149._4_4_ = fVar208;
                      auVar149._0_4_ = fVar208;
                      auVar149._8_4_ = fVar208;
                      auVar149._12_4_ = fVar208;
                      auVar18 = vfmadd132ps_fma(auVar149,auVar12,auVar15);
                      local_260 = auVar18._0_4_;
                      uStack_25c = local_260;
                      uStack_258 = local_260;
                      uStack_254 = local_260;
                      uStack_250 = local_260;
                      uStack_24c = local_260;
                      uStack_248 = local_260;
                      uStack_244 = local_260;
                      auVar12 = vmovshdup_avx(auVar18);
                      local_240 = auVar12._0_8_;
                      uStack_238 = local_240;
                      uStack_230 = local_240;
                      uStack_228 = local_240;
                      auVar12 = vshufps_avx(auVar18,auVar18,0xaa);
                      auVar150._0_8_ = auVar12._0_8_;
                      auVar150._8_8_ = auVar150._0_8_;
                      auVar158._16_8_ = auVar150._0_8_;
                      auVar158._0_16_ = auVar150;
                      auVar158._24_8_ = auVar150._0_8_;
                      local_220 = auVar158;
                      fStack_1fc = local_200;
                      fStack_1f8 = local_200;
                      fStack_1f4 = local_200;
                      fStack_1f0 = local_200;
                      fStack_1ec = local_200;
                      fStack_1e8 = local_200;
                      fStack_1e4 = local_200;
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_1c0 = CONCAT44(uStack_11c,local_120);
                      uStack_1b8 = CONCAT44(uStack_114,uStack_118);
                      uStack_1b0 = CONCAT44(uStack_10c,uStack_110);
                      uStack_1a8 = CONCAT44(uStack_104,uStack_108);
                      local_1a0._4_4_ = uStack_59c;
                      local_1a0._0_4_ = local_5a0;
                      local_1a0._8_4_ = uStack_598;
                      local_1a0._12_4_ = uStack_594;
                      local_1a0._16_4_ = uStack_590;
                      local_1a0._20_4_ = uStack_58c;
                      local_1a0._24_4_ = uStack_588;
                      local_1a0._28_4_ = uStack_584;
                      auVar109 = vpcmpeqd_avx2(local_1a0,local_1a0);
                      local_768[1] = auVar109;
                      *local_768 = auVar109;
                      local_180 = (local_7d0.context)->instID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_160 = (local_7d0.context)->instPrimID[0];
                      uStack_15c = local_160;
                      uStack_158 = local_160;
                      uStack_154 = local_160;
                      uStack_150 = local_160;
                      uStack_14c = local_160;
                      uStack_148 = local_160;
                      uStack_144 = local_160;
                      local_680[0] = local_2c0;
                      local_7d0.valid = (int *)local_680;
                      local_7d0.geometryUserPtr = pGVar9->userPtr;
                      local_7d0.hit = (RTCHitN *)&local_260;
                      local_7d0.N = 8;
                      local_7d0.ray = (RTCRayN *)ray;
                      if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar158 = ZEXT1632(auVar150);
                        auVar212 = ZEXT1664(auVar212._0_16_);
                        auVar223 = ZEXT1664(auVar223._0_16_);
                        (*pGVar9->intersectionFilterN)(&local_7d0);
                      }
                      auVar117 = vpcmpeqd_avx2(local_680[0],_DAT_01faff00);
                      auVar116 = vpcmpeqd_avx2(auVar158,auVar158);
                      auVar109 = auVar116 & ~auVar117;
                      if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar109 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar109 >> 0x7f,0) == '\0') &&
                            (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar109 >> 0xbf,0) == '\0') &&
                          (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar109[0x1f]) {
                        auVar117 = auVar117 ^ auVar116;
                      }
                      else {
                        p_Var10 = context->args->filter;
                        if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar116 = ZEXT1632(auVar116._0_16_);
                          auVar212 = ZEXT1664(auVar212._0_16_);
                          auVar223 = ZEXT1664(auVar223._0_16_);
                          (*p_Var10)(&local_7d0);
                        }
                        auVar132 = vpcmpeqd_avx2(local_680[0],
                                                 SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                        auVar116 = vpcmpeqd_avx2(auVar116,auVar116);
                        auVar117 = auVar132 ^ auVar116;
                        auVar109 = auVar116 & ~auVar132;
                        if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar109 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar109 >> 0x7f,0) != '\0')
                              || (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar109 >> 0xbf,0) != '\0') ||
                            (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar109[0x1f] < '\0') {
                          auVar137._0_4_ = auVar132._0_4_ ^ auVar116._0_4_;
                          auVar137._4_4_ = auVar132._4_4_ ^ auVar116._4_4_;
                          auVar137._8_4_ = auVar132._8_4_ ^ auVar116._8_4_;
                          auVar137._12_4_ = auVar132._12_4_ ^ auVar116._12_4_;
                          auVar137._16_4_ = auVar132._16_4_ ^ auVar116._16_4_;
                          auVar137._20_4_ = auVar132._20_4_ ^ auVar116._20_4_;
                          auVar137._24_4_ = auVar132._24_4_ ^ auVar116._24_4_;
                          auVar137._28_4_ = auVar132._28_4_ ^ auVar116._28_4_;
                          auVar109 = vmaskmovps_avx(auVar137,*(undefined1 (*) [32])local_7d0.hit);
                          *(undefined1 (*) [32])(local_7d0.ray + 0x180) = auVar109;
                          auVar109 = vmaskmovps_avx(auVar137,*(undefined1 (*) [32])
                                                              (local_7d0.hit + 0x20));
                          *(undefined1 (*) [32])(local_7d0.ray + 0x1a0) = auVar109;
                          auVar109 = vmaskmovps_avx(auVar137,*(undefined1 (*) [32])
                                                              (local_7d0.hit + 0x40));
                          *(undefined1 (*) [32])(local_7d0.ray + 0x1c0) = auVar109;
                          auVar109 = vmaskmovps_avx(auVar137,*(undefined1 (*) [32])
                                                              (local_7d0.hit + 0x60));
                          *(undefined1 (*) [32])(local_7d0.ray + 0x1e0) = auVar109;
                          auVar109 = vmaskmovps_avx(auVar137,*(undefined1 (*) [32])
                                                              (local_7d0.hit + 0x80));
                          *(undefined1 (*) [32])(local_7d0.ray + 0x200) = auVar109;
                          auVar109 = vpmaskmovd_avx2(auVar137,*(undefined1 (*) [32])
                                                               (local_7d0.hit + 0xa0));
                          *(undefined1 (*) [32])(local_7d0.ray + 0x220) = auVar109;
                          auVar109 = vpmaskmovd_avx2(auVar137,*(undefined1 (*) [32])
                                                               (local_7d0.hit + 0xc0));
                          *(undefined1 (*) [32])(local_7d0.ray + 0x240) = auVar109;
                          auVar109 = vpmaskmovd_avx2(auVar137,*(undefined1 (*) [32])
                                                               (local_7d0.hit + 0xe0));
                          *(undefined1 (*) [32])(local_7d0.ray + 0x260) = auVar109;
                          auVar109 = vpmaskmovd_avx2(auVar137,*(undefined1 (*) [32])
                                                               (local_7d0.hit + 0x100));
                          *(undefined1 (*) [32])(local_7d0.ray + 0x280) = auVar109;
                        }
                      }
                      auVar109 = local_600;
                      if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar117 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar117 >> 0x7f,0) == '\0') &&
                            (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar117 >> 0xbf,0) == '\0') &&
                          (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar117[0x1f]) {
                        *(undefined4 *)(ray + k * 4 + 0x100) = uVar102;
                      }
                      else {
                        uVar102 = *(undefined4 *)(ray + k * 4 + 0x100);
                      }
                      *(undefined4 *)(local_6a0 + uVar97 * 4) = 0;
                      auVar118._4_4_ = uVar102;
                      auVar118._0_4_ = uVar102;
                      auVar118._8_4_ = uVar102;
                      auVar118._12_4_ = uVar102;
                      auVar118._16_4_ = uVar102;
                      auVar118._20_4_ = uVar102;
                      auVar118._24_4_ = uVar102;
                      auVar118._28_4_ = uVar102;
                      auVar116 = vcmpps_avx(auVar109,auVar118,2);
                      auVar117 = vandps_avx(auVar116,local_6a0);
                      local_6a0 = local_6a0 & auVar116;
                      if ((((((((local_6a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (local_6a0 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (local_6a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(local_6a0 >> 0x7f,0) == '\0') &&
                            (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(local_6a0 >> 0xbf,0) == '\0') &&
                          (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < local_6a0[0x1f]) break;
                      auVar138._8_4_ = 0x7f800000;
                      auVar138._0_8_ = 0x7f8000007f800000;
                      auVar138._12_4_ = 0x7f800000;
                      auVar138._16_4_ = 0x7f800000;
                      auVar138._20_4_ = 0x7f800000;
                      auVar138._24_4_ = 0x7f800000;
                      auVar138._28_4_ = 0x7f800000;
                      auVar109 = vblendvps_avx(auVar138,auVar109,auVar117);
                      auVar116 = vshufps_avx(auVar109,auVar109,0xb1);
                      auVar116 = vminps_avx(auVar109,auVar116);
                      auVar132 = vshufpd_avx(auVar116,auVar116,5);
                      auVar116 = vminps_avx(auVar116,auVar132);
                      auVar132 = vpermpd_avx2(auVar116,0x4e);
                      auVar116 = vminps_avx(auVar116,auVar132);
                      auVar116 = vcmpps_avx(auVar109,auVar116,0);
                      auVar132 = auVar117 & auVar116;
                      auVar109 = auVar117;
                      if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar132 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar132 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar132 >> 0x7f,0) != '\0') ||
                            (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar132 >> 0xbf,0) != '\0') ||
                          (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar132[0x1f] < '\0') {
                        auVar109 = vandps_avx(auVar116,auVar117);
                      }
                      uVar96 = vmovmskps_avx(auVar109);
                      uVar98 = 0;
                      for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
                        uVar98 = uVar98 + 1;
                      }
                      uVar97 = (ulong)uVar98;
                      local_6a0 = auVar117;
                    }
                  }
                }
              }
              auVar141 = ZEXT3264(local_720);
            }
          }
          lVar100 = lVar100 + 8;
          auVar166 = ZEXT3264(local_6c0);
        } while ((int)lVar100 < iVar95);
      }
      uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar108._4_4_ = uVar4;
      auVar108._0_4_ = uVar4;
      auVar108._8_4_ = uVar4;
      auVar108._12_4_ = uVar4;
      auVar12 = vcmpps_avx(local_420,auVar108,2);
      uVar98 = vmovmskps_avx(auVar12);
      uVar98 = (uint)uVar101 & uVar98;
    } while (uVar98 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }